

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  size_t k;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [28];
  byte bVar46;
  int iVar47;
  ulong uVar48;
  byte bVar49;
  byte bVar50;
  long lVar51;
  undefined1 (*pauVar52) [32];
  ulong uVar53;
  byte bVar54;
  long lVar55;
  ulong *puVar56;
  NodeRef root;
  ulong uVar57;
  long lVar58;
  undefined4 uVar59;
  float *pfVar60;
  bool bVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar87 [32];
  undefined1 auVar90 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [32];
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar134 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [36];
  undefined1 auVar143 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  Precalculations pre;
  vfloat<4> lower_y;
  vfloat<4> upper_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  vfloat<4> lower_x;
  TravRayK<8,_false> tray;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_2ce4;
  Precalculations local_2cc9;
  uint local_2cc8;
  uint local_2cc4;
  undefined1 local_2cc0 [16];
  undefined1 local_2cb0 [16];
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  Geometry *local_2c80;
  undefined4 local_2c74;
  RTCFilterFunctionNArguments local_2c70;
  undefined1 local_2c40 [8];
  float fStack_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  float fStack_2c24;
  undefined1 (*local_2c08) [32];
  RayK<8> *local_2c00;
  long local_2bf8;
  long local_2bf0;
  ulong local_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [16];
  undefined1 local_2bb0 [16];
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  BVH *local_2b70;
  Intersectors *local_2b68;
  long local_2b60;
  long local_2b58;
  long local_2b50;
  ulong local_2b48;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  float local_2ae0;
  float fStack_2adc;
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  int iStack_2ac4;
  RTCHitN local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [8];
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  uint uStack_2a44;
  undefined1 local_2a40 [8];
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float fStack_2a24;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  uint local_29e0;
  uint uStack_29dc;
  uint uStack_29d8;
  uint uStack_29d4;
  uint uStack_29d0;
  uint uStack_29cc;
  uint uStack_29c8;
  uint uStack_29c4;
  uint local_29c0;
  uint uStack_29bc;
  uint uStack_29b8;
  uint uStack_29b4;
  uint uStack_29b0;
  uint uStack_29ac;
  uint uStack_29a8;
  uint uStack_29a4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29a0;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  undefined4 uStack_2864;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [32];
  int local_2820;
  int iStack_281c;
  int iStack_2818;
  int iStack_2814;
  int iStack_2810;
  int iStack_280c;
  int iStack_2808;
  int iStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  uint local_27e0;
  uint uStack_27dc;
  uint uStack_27d8;
  uint uStack_27d4;
  uint uStack_27d0;
  uint uStack_27cc;
  uint uStack_27c8;
  uint uStack_27c4;
  undefined1 local_27c0 [32];
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  undefined1 local_2780 [16];
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 local_2690;
  undefined8 uStack_2688;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar145 [36];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar69 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar63 = ZEXT816(0) << 0x40;
      uVar62 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar63),5);
      uVar57 = vpcmpeqd_avx512vl(auVar69,(undefined1  [32])valid_i->field_0);
      uVar62 = uVar62 & uVar57;
      local_2ce4 = (byte)uVar62;
      if (local_2ce4 != 0) {
        local_29a0._0_4_ = *(float *)ray;
        local_29a0._4_4_ = *(float *)(ray + 4);
        local_29a0._8_4_ = *(float *)(ray + 8);
        local_29a0._12_4_ = *(float *)(ray + 0xc);
        local_29a0._16_4_ = *(float *)(ray + 0x10);
        local_29a0._20_4_ = *(float *)(ray + 0x14);
        local_29a0._24_4_ = *(float *)(ray + 0x18);
        local_29a0._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_29a0._32_4_ = *(float *)(ray + 0x20);
        local_29a0._36_4_ = *(float *)(ray + 0x24);
        local_29a0._40_4_ = *(float *)(ray + 0x28);
        local_29a0._44_4_ = *(float *)(ray + 0x2c);
        local_29a0._48_4_ = *(float *)(ray + 0x30);
        local_29a0._52_4_ = *(float *)(ray + 0x34);
        local_29a0._56_4_ = *(float *)(ray + 0x38);
        local_29a0._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_29a0._64_4_ = *(float *)(ray + 0x40);
        local_29a0._68_4_ = *(float *)(ray + 0x44);
        local_29a0._72_4_ = *(float *)(ray + 0x48);
        local_29a0._76_4_ = *(float *)(ray + 0x4c);
        local_29a0._80_4_ = *(float *)(ray + 0x50);
        local_29a0._84_4_ = *(float *)(ray + 0x54);
        local_29a0._88_4_ = *(float *)(ray + 0x58);
        local_29a0._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_2940 = *(undefined1 (*) [32])(ray + 0x80);
        local_2920 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2900 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar146 = ZEXT3264(auVar69);
        vandps_avx512vl(local_2940,auVar69);
        auVar70._8_4_ = 0x219392ef;
        auVar70._0_8_ = 0x219392ef219392ef;
        auVar70._12_4_ = 0x219392ef;
        auVar70._16_4_ = 0x219392ef;
        auVar70._20_4_ = 0x219392ef;
        auVar70._24_4_ = 0x219392ef;
        auVar70._28_4_ = 0x219392ef;
        uVar57 = vcmpps_avx512vl(auVar69,auVar70,1);
        bVar61 = (bool)((byte)uVar57 & 1);
        auVar71._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._0_4_;
        bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
        auVar71._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._4_4_;
        bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
        auVar71._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._8_4_;
        bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
        auVar71._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._12_4_;
        bVar61 = (bool)((byte)(uVar57 >> 4) & 1);
        auVar71._16_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._16_4_;
        bVar61 = (bool)((byte)(uVar57 >> 5) & 1);
        auVar71._20_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._20_4_;
        bVar61 = (bool)((byte)(uVar57 >> 6) & 1);
        auVar71._24_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._24_4_;
        bVar61 = SUB81(uVar57 >> 7,0);
        auVar71._28_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2940._28_4_;
        vandps_avx512vl(local_2920,auVar69);
        uVar57 = vcmpps_avx512vl(auVar71,auVar70,1);
        bVar61 = (bool)((byte)uVar57 & 1);
        auVar74._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._0_4_;
        bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
        auVar74._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._4_4_;
        bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
        auVar74._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._8_4_;
        bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
        auVar74._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._12_4_;
        bVar61 = (bool)((byte)(uVar57 >> 4) & 1);
        auVar74._16_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._16_4_;
        bVar61 = (bool)((byte)(uVar57 >> 5) & 1);
        auVar74._20_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._20_4_;
        bVar61 = (bool)((byte)(uVar57 >> 6) & 1);
        auVar74._24_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._24_4_;
        bVar61 = SUB81(uVar57 >> 7,0);
        auVar74._28_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2920._28_4_;
        vandps_avx512vl(local_2900,auVar69);
        uVar57 = vcmpps_avx512vl(auVar74,auVar70,1);
        bVar61 = (bool)((byte)uVar57 & 1);
        auVar69._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._0_4_;
        bVar61 = (bool)((byte)(uVar57 >> 1) & 1);
        auVar69._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._4_4_;
        bVar61 = (bool)((byte)(uVar57 >> 2) & 1);
        auVar69._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._8_4_;
        bVar61 = (bool)((byte)(uVar57 >> 3) & 1);
        auVar69._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._12_4_;
        bVar61 = (bool)((byte)(uVar57 >> 4) & 1);
        auVar69._16_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._16_4_;
        bVar61 = (bool)((byte)(uVar57 >> 5) & 1);
        auVar69._20_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._20_4_;
        bVar61 = (bool)((byte)(uVar57 >> 6) & 1);
        auVar69._24_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._24_4_;
        bVar61 = SUB81(uVar57 >> 7,0);
        auVar69._28_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * local_2900._28_4_;
        auVar72._8_4_ = 0x3f800000;
        auVar72._0_8_ = 0x3f8000003f800000;
        auVar72._12_4_ = 0x3f800000;
        auVar72._16_4_ = 0x3f800000;
        auVar72._20_4_ = 0x3f800000;
        auVar72._24_4_ = 0x3f800000;
        auVar72._28_4_ = 0x3f800000;
        auVar70 = vrcp14ps_avx512vl(auVar71);
        auVar64 = vfnmadd213ps_fma(auVar71,auVar70,auVar72);
        auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar70,auVar70);
        auVar71 = vrcp14ps_avx512vl(auVar74);
        auVar65 = vfnmadd213ps_fma(auVar74,auVar71,auVar72);
        auVar65 = vfmadd132ps_fma(ZEXT1632(auVar65),auVar71,auVar71);
        auVar71 = vrcp14ps_avx512vl(auVar69);
        auVar68 = vfnmadd213ps_fma(auVar69,auVar71,auVar72);
        local_28e0 = ZEXT1632(auVar64);
        local_28c0 = ZEXT1632(auVar65);
        auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar71,auVar71);
        local_28a0 = ZEXT1632(auVar68);
        local_2840._4_4_ = *(float *)(ray + 0x44) * auVar68._4_4_;
        local_2840._0_4_ = *(float *)(ray + 0x40) * auVar68._0_4_;
        local_2840._8_4_ = *(float *)(ray + 0x48) * auVar68._8_4_;
        local_2840._12_4_ = *(float *)(ray + 0x4c) * auVar68._12_4_;
        local_2840._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_2840._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_2840._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_2840._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_2880 = *(float *)ray * auVar64._0_4_;
        fStack_287c = *(float *)(ray + 4) * auVar64._4_4_;
        fStack_2878 = *(float *)(ray + 8) * auVar64._8_4_;
        fStack_2874 = *(float *)(ray + 0xc) * auVar64._12_4_;
        fStack_2870 = *(float *)(ray + 0x10) * 0.0;
        fStack_286c = *(float *)(ray + 0x14) * 0.0;
        fStack_2868 = *(float *)(ray + 0x18) * 0.0;
        uStack_2864 = *(undefined4 *)(ray + 0x1c);
        local_2860 = *(float *)(ray + 0x20) * auVar65._0_4_;
        fStack_285c = *(float *)(ray + 0x24) * auVar65._4_4_;
        fStack_2858 = *(float *)(ray + 0x28) * auVar65._8_4_;
        fStack_2854 = *(float *)(ray + 0x2c) * auVar65._12_4_;
        fStack_2850 = *(float *)(ray + 0x30) * 0.0;
        fStack_284c = *(float *)(ray + 0x34) * 0.0;
        fStack_2848 = *(float *)(ray + 0x38) * 0.0;
        uStack_2844 = *(undefined4 *)(ray + 0x3c);
        uVar57 = vcmpps_avx512vl(ZEXT1632(auVar64),ZEXT1632(auVar63),1);
        auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_2820 = (uint)((byte)uVar57 & 1) * auVar69._0_4_;
        iStack_281c = (uint)((byte)(uVar57 >> 1) & 1) * auVar69._4_4_;
        iStack_2818 = (uint)((byte)(uVar57 >> 2) & 1) * auVar69._8_4_;
        iStack_2814 = (uint)((byte)(uVar57 >> 3) & 1) * auVar69._12_4_;
        iStack_2810 = (uint)((byte)(uVar57 >> 4) & 1) * auVar69._16_4_;
        iStack_280c = (uint)((byte)(uVar57 >> 5) & 1) * auVar69._20_4_;
        iStack_2808 = (uint)((byte)(uVar57 >> 6) & 1) * auVar69._24_4_;
        iStack_2804 = (uint)(byte)(uVar57 >> 7) * auVar69._28_4_;
        auVar71 = ZEXT1632(auVar63);
        uVar57 = vcmpps_avx512vl(ZEXT1632(auVar65),auVar71,5);
        auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar61 = (bool)((byte)uVar57 & 1);
        bVar13 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar23 = SUB81(uVar57 >> 7,0);
        local_2800 = (uint)bVar61 * auVar69._0_4_ | (uint)!bVar61 * 0x30;
        uStack_27fc = (uint)bVar13 * auVar69._4_4_ | (uint)!bVar13 * 0x30;
        uStack_27f8 = (uint)bVar14 * auVar69._8_4_ | (uint)!bVar14 * 0x30;
        uStack_27f4 = (uint)bVar15 * auVar69._12_4_ | (uint)!bVar15 * 0x30;
        uStack_27f0 = (uint)bVar16 * auVar69._16_4_ | (uint)!bVar16 * 0x30;
        uStack_27ec = (uint)bVar17 * auVar69._20_4_ | (uint)!bVar17 * 0x30;
        uStack_27e8 = (uint)bVar20 * auVar69._24_4_ | (uint)!bVar20 * 0x30;
        uStack_27e4 = (uint)bVar23 * auVar69._28_4_ | (uint)!bVar23 * 0x30;
        uVar57 = vcmpps_avx512vl(ZEXT1632(auVar68),auVar71,5);
        auVar69 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar61 = (bool)((byte)uVar57 & 1);
        bVar13 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar23 = SUB81(uVar57 >> 7,0);
        local_27e0 = (uint)bVar61 * auVar69._0_4_ | (uint)!bVar61 * 0x50;
        uStack_27dc = (uint)bVar13 * auVar69._4_4_ | (uint)!bVar13 * 0x50;
        uStack_27d8 = (uint)bVar14 * auVar69._8_4_ | (uint)!bVar14 * 0x50;
        uStack_27d4 = (uint)bVar15 * auVar69._12_4_ | (uint)!bVar15 * 0x50;
        uStack_27d0 = (uint)bVar16 * auVar69._16_4_ | (uint)!bVar16 * 0x50;
        uStack_27cc = (uint)bVar17 * auVar69._20_4_ | (uint)!bVar17 * 0x50;
        uStack_27c8 = (uint)bVar20 * auVar69._24_4_ | (uint)!bVar20 * 0x50;
        uStack_27c4 = (uint)bVar23 * auVar69._28_4_ | (uint)!bVar23 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar148 = ZEXT3264(local_1e80);
        auVar69 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar71);
        local_27c0._0_4_ =
             (uint)(local_2ce4 & 1) * auVar69._0_4_ |
             (uint)!(bool)(local_2ce4 & 1) * local_1e80._0_4_;
        bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
        local_27c0._4_4_ = (uint)bVar61 * auVar69._4_4_ | (uint)!bVar61 * local_1e80._4_4_;
        bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
        local_27c0._8_4_ = (uint)bVar61 * auVar69._8_4_ | (uint)!bVar61 * local_1e80._8_4_;
        bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
        local_27c0._12_4_ = (uint)bVar61 * auVar69._12_4_ | (uint)!bVar61 * local_1e80._12_4_;
        bVar61 = (bool)((byte)(uVar62 >> 4) & 1);
        local_27c0._16_4_ = (uint)bVar61 * auVar69._16_4_ | (uint)!bVar61 * local_1e80._16_4_;
        bVar61 = (bool)((byte)(uVar62 >> 5) & 1);
        local_27c0._20_4_ = (uint)bVar61 * auVar69._20_4_ | (uint)!bVar61 * local_1e80._20_4_;
        bVar61 = (bool)((byte)(uVar62 >> 6) & 1);
        local_27c0._24_4_ = (uint)bVar61 * auVar69._24_4_ | (uint)!bVar61 * local_1e80._24_4_;
        bVar61 = SUB81(uVar62 >> 7,0);
        local_27c0._28_4_ = (uint)bVar61 * auVar69._28_4_ | (uint)!bVar61 * local_1e80._28_4_;
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar147 = ZEXT3264(auVar69);
        local_2c74 = (undefined4)uVar62;
        auVar71 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar71);
        bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar20 = SUB81(uVar62 >> 7,0);
        local_27a0 = (uint)(local_2ce4 & 1) * auVar71._0_4_ |
                     (uint)!(bool)(local_2ce4 & 1) * auVar69._0_4_;
        uStack_279c = (uint)bVar61 * auVar71._4_4_ | (uint)!bVar61 * auVar69._4_4_;
        uStack_2798 = (uint)bVar13 * auVar71._8_4_ | (uint)!bVar13 * auVar69._8_4_;
        uStack_2794 = (uint)bVar14 * auVar71._12_4_ | (uint)!bVar14 * auVar69._12_4_;
        uStack_2790 = (uint)bVar15 * auVar71._16_4_ | (uint)!bVar15 * auVar69._16_4_;
        uStack_278c = (uint)bVar16 * auVar71._20_4_ | (uint)!bVar16 * auVar69._20_4_;
        uStack_2788 = (uint)bVar17 * auVar71._24_4_ | (uint)!bVar17 * auVar69._24_4_;
        uStack_2784 = (uint)bVar20 * auVar71._28_4_ | (uint)!bVar20 * auVar69._28_4_;
        local_2ce4 = ~local_2ce4;
        local_2b68 = This;
        local_2b70 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar62 = 5;
        }
        else {
          uVar62 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2c00 = ray + 0x100;
        puVar56 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar52 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_27c0;
        local_2c08 = (undefined1 (*) [32])&local_29e0;
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar149 = ZEXT3264(auVar69);
        auVar63 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar150 = ZEXT1664(auVar63);
        local_2be8 = uVar62;
LAB_00714212:
        do {
          auVar69 = auVar147._0_32_;
          auVar73._4_4_ = uStack_279c;
          auVar73._0_4_ = local_27a0;
          auVar73._8_4_ = uStack_2798;
          auVar73._12_4_ = uStack_2794;
          auVar73._16_4_ = uStack_2790;
          auVar73._20_4_ = uStack_278c;
          auVar73._24_4_ = uStack_2788;
          auVar73._28_4_ = uStack_2784;
          do {
            root.ptr = puVar56[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00715532;
            puVar56 = puVar56 + -1;
            _local_2c40 = pauVar52[-1];
            auVar99 = ZEXT3264(_local_2c40);
            pauVar52 = pauVar52 + -1;
            uVar57 = vcmpps_avx512vl(_local_2c40,auVar73,1);
          } while ((char)uVar57 == '\0');
          uVar59 = (undefined4)uVar57;
          if (uVar62 < (uint)POPCOUNT(uVar59)) {
LAB_0071425a:
            do {
              uVar57 = 8;
              auVar69 = auVar147._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00715532;
                auVar85._4_4_ = uStack_279c;
                auVar85._0_4_ = local_27a0;
                auVar85._8_4_ = uStack_2798;
                auVar85._12_4_ = uStack_2794;
                auVar85._16_4_ = uStack_2790;
                auVar85._20_4_ = uStack_278c;
                auVar85._24_4_ = uStack_2788;
                auVar85._28_4_ = uStack_2784;
                uVar24 = vcmpps_avx512vl(auVar99._0_32_,auVar85,9);
                if ((char)uVar24 != '\0') {
                  local_2b60 = (ulong)((uint)root.ptr & 0xf) - 8;
                  bVar50 = local_2ce4;
                  if (local_2b60 != 0) {
                    uVar57 = root.ptr & 0xfffffffffffffff0;
                    bVar50 = ~local_2ce4;
                    lVar51 = 0;
                    do {
                      local_2b58 = lVar51;
                      lVar51 = lVar51 * 0x58;
                      auVar63._8_8_ = 0;
                      auVar63._0_8_ = *(ulong *)(uVar57 + 0x20 + lVar51);
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = *(ulong *)(uVar57 + 0x24 + lVar51);
                      uVar53 = vpcmpub_avx512vl(auVar63,auVar64,2);
                      if ((uVar53 & 0xf) != 0) {
                        lVar51 = lVar51 + uVar57;
                        uVar53 = (ulong)((byte)uVar53 & 0xf);
                        local_2b50 = lVar51;
                        do {
                          lVar55 = 0;
                          for (uVar48 = uVar53; (uVar48 & 1) == 0;
                              uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                            lVar55 = lVar55 + 1;
                          }
                          auVar65._8_8_ = 0;
                          auVar65._0_8_ = *(ulong *)(lVar51 + 0x20);
                          auVar63 = vpmovzxbd_avx(auVar65);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          uVar59 = *(undefined4 *)(lVar51 + 0x44);
                          auVar93._4_4_ = uVar59;
                          auVar93._0_4_ = uVar59;
                          auVar93._8_4_ = uVar59;
                          auVar93._12_4_ = uVar59;
                          uVar59 = *(undefined4 *)(lVar51 + 0x38);
                          auVar101._4_4_ = uVar59;
                          auVar101._0_4_ = uVar59;
                          auVar101._8_4_ = uVar59;
                          auVar101._12_4_ = uVar59;
                          auVar63 = vfmadd213ps_fma(auVar63,auVar93,auVar101);
                          local_2ac0[0] = (RTCHitN)auVar63[0];
                          local_2ac0[1] = (RTCHitN)auVar63[1];
                          local_2ac0[2] = (RTCHitN)auVar63[2];
                          local_2ac0[3] = (RTCHitN)auVar63[3];
                          local_2ac0[4] = (RTCHitN)auVar63[4];
                          local_2ac0[5] = (RTCHitN)auVar63[5];
                          local_2ac0[6] = (RTCHitN)auVar63[6];
                          local_2ac0[7] = (RTCHitN)auVar63[7];
                          local_2ac0[8] = (RTCHitN)auVar63[8];
                          local_2ac0[9] = (RTCHitN)auVar63[9];
                          local_2ac0[10] = (RTCHitN)auVar63[10];
                          local_2ac0[0xb] = (RTCHitN)auVar63[0xb];
                          local_2ac0[0xc] = (RTCHitN)auVar63[0xc];
                          local_2ac0[0xd] = (RTCHitN)auVar63[0xd];
                          local_2ac0[0xe] = (RTCHitN)auVar63[0xe];
                          local_2ac0[0xf] = (RTCHitN)auVar63[0xf];
                          auVar68._8_8_ = 0;
                          auVar68._0_8_ = *(ulong *)(lVar51 + 0x24);
                          auVar63 = vpmovzxbd_avx(auVar68);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          local_2780 = vfmadd213ps_fma(auVar63,auVar93,auVar101);
                          auVar67._8_8_ = 0;
                          auVar67._0_8_ = *(ulong *)(lVar51 + 0x28);
                          auVar63 = vpmovzxbd_avx(auVar67);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          uVar59 = *(undefined4 *)(lVar51 + 0x48);
                          auVar94._4_4_ = uVar59;
                          auVar94._0_4_ = uVar59;
                          auVar94._8_4_ = uVar59;
                          auVar94._12_4_ = uVar59;
                          uVar59 = *(undefined4 *)(lVar51 + 0x3c);
                          auVar102._4_4_ = uVar59;
                          auVar102._0_4_ = uVar59;
                          auVar102._8_4_ = uVar59;
                          auVar102._12_4_ = uVar59;
                          auVar63 = vfmadd213ps_fma(auVar63,auVar94,auVar102);
                          local_2c70.valid = (int *)auVar63._0_8_;
                          local_2c70.geometryUserPtr = (void *)auVar63._8_8_;
                          auVar88._8_8_ = 0;
                          auVar88._0_8_ = *(ulong *)(lVar51 + 0x2c);
                          auVar63 = vpmovzxbd_avx(auVar88);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          auVar63 = vfmadd213ps_fma(auVar63,auVar94,auVar102);
                          local_2be0._0_16_ = auVar63;
                          auVar66._8_8_ = 0;
                          auVar66._0_8_ = *(ulong *)(lVar51 + 0x30);
                          auVar63 = vpmovzxbd_avx(auVar66);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          uVar59 = *(undefined4 *)(lVar51 + 0x4c);
                          auVar95._4_4_ = uVar59;
                          auVar95._0_4_ = uVar59;
                          auVar95._8_4_ = uVar59;
                          auVar95._12_4_ = uVar59;
                          uVar59 = *(undefined4 *)(lVar51 + 0x40);
                          auVar103._4_4_ = uVar59;
                          auVar103._0_4_ = uVar59;
                          auVar103._8_4_ = uVar59;
                          auVar103._12_4_ = uVar59;
                          local_2bb0 = vfmadd213ps_fma(auVar63,auVar95,auVar103);
                          auVar89._8_8_ = 0;
                          auVar89._0_8_ = *(ulong *)(lVar51 + 0x34);
                          auVar63 = vpmovzxbd_avx(auVar89);
                          auVar63 = vcvtdq2ps_avx(auVar63);
                          local_2bc0 = vfmadd213ps_fma(auVar63,auVar95,auVar103);
                          auVar39._4_4_ = fStack_287c;
                          auVar39._0_4_ = local_2880;
                          auVar39._8_4_ = fStack_2878;
                          auVar39._12_4_ = fStack_2874;
                          auVar39._16_4_ = fStack_2870;
                          auVar39._20_4_ = fStack_286c;
                          auVar39._24_4_ = fStack_2868;
                          auVar39._28_4_ = uStack_2864;
                          uVar48 = (ulong)(uint)((int)lVar55 * 4);
                          uVar59 = *(undefined4 *)(local_2ac0 + uVar48);
                          auVar109._4_4_ = uVar59;
                          auVar109._0_4_ = uVar59;
                          auVar109._8_4_ = uVar59;
                          auVar109._12_4_ = uVar59;
                          auVar109._16_4_ = uVar59;
                          auVar109._20_4_ = uVar59;
                          auVar109._24_4_ = uVar59;
                          auVar109._28_4_ = uVar59;
                          auVar63 = vfmsub132ps_fma(auVar109,auVar39,local_28e0);
                          auVar40._4_4_ = fStack_285c;
                          auVar40._0_4_ = local_2860;
                          auVar40._8_4_ = fStack_2858;
                          auVar40._12_4_ = fStack_2854;
                          auVar40._16_4_ = fStack_2850;
                          auVar40._20_4_ = fStack_284c;
                          auVar40._24_4_ = fStack_2848;
                          auVar40._28_4_ = uStack_2844;
                          uVar59 = *(undefined4 *)((long)&local_2c70.valid + uVar48);
                          auVar118._4_4_ = uVar59;
                          auVar118._0_4_ = uVar59;
                          auVar118._8_4_ = uVar59;
                          auVar118._12_4_ = uVar59;
                          auVar118._16_4_ = uVar59;
                          auVar118._20_4_ = uVar59;
                          auVar118._24_4_ = uVar59;
                          auVar118._28_4_ = uVar59;
                          uVar59 = *(undefined4 *)(local_2bb0 + uVar48);
                          auVar121._4_4_ = uVar59;
                          auVar121._0_4_ = uVar59;
                          auVar121._8_4_ = uVar59;
                          auVar121._12_4_ = uVar59;
                          auVar121._16_4_ = uVar59;
                          auVar121._20_4_ = uVar59;
                          auVar121._24_4_ = uVar59;
                          auVar121._28_4_ = uVar59;
                          auVar64 = vfmsub132ps_fma(auVar118,auVar40,local_28c0);
                          auVar65 = vfmsub132ps_fma(auVar121,local_2840,local_28a0);
                          uVar59 = *(undefined4 *)(local_2780 + uVar48);
                          auVar86._4_4_ = uVar59;
                          auVar86._0_4_ = uVar59;
                          auVar86._8_4_ = uVar59;
                          auVar86._12_4_ = uVar59;
                          auVar86._16_4_ = uVar59;
                          auVar86._20_4_ = uVar59;
                          auVar86._24_4_ = uVar59;
                          auVar86._28_4_ = uVar59;
                          auVar74 = vfmsub132ps_avx512vl(local_28e0,auVar39,auVar86);
                          uVar59 = *(undefined4 *)(local_2be0 + uVar48);
                          auVar26._4_4_ = uVar59;
                          auVar26._0_4_ = uVar59;
                          auVar26._8_4_ = uVar59;
                          auVar26._12_4_ = uVar59;
                          auVar26._16_4_ = uVar59;
                          auVar26._20_4_ = uVar59;
                          auVar26._24_4_ = uVar59;
                          auVar26._28_4_ = uVar59;
                          auVar70 = vfmsub132ps_avx512vl(local_28c0,auVar40,auVar26);
                          uVar59 = *(undefined4 *)(local_2bc0 + uVar48);
                          auVar27._4_4_ = uVar59;
                          auVar27._0_4_ = uVar59;
                          auVar27._8_4_ = uVar59;
                          auVar27._12_4_ = uVar59;
                          auVar27._16_4_ = uVar59;
                          auVar27._20_4_ = uVar59;
                          auVar27._24_4_ = uVar59;
                          auVar27._28_4_ = uVar59;
                          auVar72 = vfmsub132ps_avx512vl(local_28a0,local_2840,auVar27);
                          auVar69 = vpminsd_avx2(ZEXT1632(auVar63),auVar74);
                          auVar71 = vpminsd_avx2(ZEXT1632(auVar64),auVar70);
                          auVar69 = vpmaxsd_avx2(auVar69,auVar71);
                          auVar71 = vpminsd_avx2(ZEXT1632(auVar65),auVar72);
                          auVar69 = vpmaxsd_avx2(auVar69,auVar71);
                          auVar71 = vpmaxsd_avx2(ZEXT1632(auVar63),auVar74);
                          auVar74 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar70);
                          auVar74 = vpminsd_avx2(auVar71,auVar74);
                          auVar71 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar72);
                          auVar71 = vpminsd_avx2(auVar74,auVar71);
                          auVar69 = vpmaxsd_avx2(auVar69,local_27c0);
                          auVar41._4_4_ = uStack_279c;
                          auVar41._0_4_ = local_27a0;
                          auVar41._8_4_ = uStack_2798;
                          auVar41._12_4_ = uStack_2794;
                          auVar41._16_4_ = uStack_2790;
                          auVar41._20_4_ = uStack_278c;
                          auVar41._24_4_ = uStack_2788;
                          auVar41._28_4_ = uStack_2784;
                          auVar71 = vpminsd_avx2(auVar71,auVar41);
                          uVar24 = vpcmpd_avx512vl(auVar69,auVar71,2);
                          if ((bVar50 & (byte)uVar24) == 0) {
                            bVar61 = false;
                          }
                          else {
                            local_2b48 = uVar53;
                            uVar6 = *(ushort *)(lVar51 + lVar55 * 8);
                            uVar7 = *(ushort *)(lVar51 + 2 + lVar55 * 8);
                            pGVar9 = (context->scene->geometries).items[*(uint *)(lVar51 + 0x50)].
                                     ptr;
                            local_2bf0 = *(long *)&pGVar9->field_0x58;
                            lVar10 = *(long *)&pGVar9[1].time_range.upper;
                            local_2bf8 = (ulong)*(uint *)(lVar51 + 4 + lVar55 * 8) *
                                         pGVar9[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                            local_2cc4 = uVar6 & 0x7fff;
                            local_2cc8 = uVar7 & 0x7fff;
                            uVar8 = *(uint *)(local_2bf0 + 4 + local_2bf8);
                            uVar62 = (ulong)uVar8;
                            uVar48 = (ulong)(uVar8 * local_2cc8 +
                                            *(int *)(local_2bf0 + local_2bf8) + local_2cc4);
                            p_Var11 = pGVar9[1].intersectionFilterN;
                            puVar2 = (undefined8 *)(lVar10 + (uVar48 + 1) * (long)p_Var11);
                            local_2770 = *puVar2;
                            uStack_2768 = puVar2[1];
                            lVar51 = uVar48 + uVar62;
                            puVar2 = (undefined8 *)(lVar10 + lVar51 * (long)p_Var11);
                            local_2750 = *puVar2;
                            uStack_2748 = puVar2[1];
                            lVar55 = uVar48 + uVar62 + 1;
                            puVar2 = (undefined8 *)(lVar10 + lVar55 * (long)p_Var11);
                            local_2760 = *puVar2;
                            uStack_2758 = puVar2[1];
                            uVar53 = (ulong)(-1 < (short)uVar6);
                            puVar2 = (undefined8 *)(lVar10 + (uVar48 + uVar53 + 1) * (long)p_Var11);
                            lVar58 = uVar53 + lVar55;
                            puVar3 = (undefined8 *)(lVar10 + lVar58 * (long)p_Var11);
                            local_2720 = *puVar3;
                            uStack_2718 = puVar3[1];
                            if ((short)uVar7 < 0) {
                              uVar62 = 0;
                            }
                            puVar3 = (undefined8 *)(lVar10 + (lVar51 + uVar62) * (long)p_Var11);
                            puVar4 = (undefined8 *)(lVar10 + (lVar55 + uVar62) * (long)p_Var11);
                            local_26e0 = *puVar4;
                            uStack_26d8 = puVar4[1];
                            puVar4 = (undefined8 *)(lVar10 + (uVar62 + lVar58) * (long)p_Var11);
                            auVar63 = vpbroadcastd_avx512vl();
                            auVar99 = ZEXT1664(auVar63);
                            local_2780 = *(undefined1 (*) [16])(lVar10 + (long)p_Var11 * uVar48);
                            local_2740 = local_2770;
                            uStack_2738 = uStack_2768;
                            local_2730 = *puVar2;
                            uStack_2728 = puVar2[1];
                            local_2710 = local_2760;
                            uStack_2708 = uStack_2758;
                            local_2700 = local_2750;
                            uStack_26f8 = uStack_2748;
                            local_26f0 = local_2760;
                            uStack_26e8 = uStack_2758;
                            local_26d0 = *puVar3;
                            uStack_26c8 = puVar3[1];
                            local_26c0 = local_2760;
                            uStack_26b8 = uStack_2758;
                            local_26b0 = local_2720;
                            uStack_26a8 = uStack_2718;
                            local_26a0 = *puVar4;
                            uStack_2698 = puVar4[1];
                            local_2690 = local_26e0;
                            uStack_2688 = uStack_26d8;
                            auVar63 = vpbroadcastd_avx512vl();
                            auVar151 = ZEXT1664(auVar63);
                            pfVar60 = (float *)&uStack_2748;
                            uVar62 = 0;
                            bVar54 = bVar50;
                            do {
                              auVar64 = auVar150._0_16_;
                              fVar125 = pfVar60[-0xe];
                              auVar96._4_4_ = fVar125;
                              auVar96._0_4_ = fVar125;
                              auVar96._8_4_ = fVar125;
                              auVar96._12_4_ = fVar125;
                              auVar96._16_4_ = fVar125;
                              auVar96._20_4_ = fVar125;
                              auVar96._24_4_ = fVar125;
                              auVar96._28_4_ = fVar125;
                              fVar127 = pfVar60[-0xd];
                              auVar115._4_4_ = fVar127;
                              auVar115._0_4_ = fVar127;
                              auVar115._8_4_ = fVar127;
                              auVar115._12_4_ = fVar127;
                              auVar115._16_4_ = fVar127;
                              auVar115._20_4_ = fVar127;
                              auVar115._24_4_ = fVar127;
                              auVar115._28_4_ = fVar127;
                              fVar128 = pfVar60[-0xc];
                              auVar123._4_4_ = fVar128;
                              auVar123._0_4_ = fVar128;
                              auVar123._8_4_ = fVar128;
                              auVar123._12_4_ = fVar128;
                              auVar123._16_4_ = fVar128;
                              auVar123._20_4_ = fVar128;
                              auVar123._24_4_ = fVar128;
                              auVar123._28_4_ = fVar128;
                              local_2640 = pfVar60[-10];
                              local_2660 = pfVar60[-9];
                              local_2680 = pfVar60[-8];
                              auVar75 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar60[-6]));
                              auVar76 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar60[-5]));
                              auVar77 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar60[-4]));
                              local_2ca0 = pfVar60[-2];
                              local_2c40._4_4_ = pfVar60[-1];
                              local_2ba0 = *pfVar60;
                              local_2bb0 = vmovdqa64_avx512vl(auVar151._0_16_);
                              local_2bc0 = vmovdqa64_avx512vl(auVar99._0_16_);
                              fStack_263c = local_2640;
                              fStack_2638 = local_2640;
                              fStack_2634 = local_2640;
                              fStack_2630 = local_2640;
                              fStack_262c = local_2640;
                              fStack_2628 = local_2640;
                              fStack_2624 = local_2640;
                              fVar131 = fVar125 - local_2640;
                              auVar126._4_4_ = fVar131;
                              auVar126._0_4_ = fVar131;
                              auVar126._8_4_ = fVar131;
                              auVar126._12_4_ = fVar131;
                              auVar126._16_4_ = fVar131;
                              auVar126._20_4_ = fVar131;
                              auVar126._24_4_ = fVar131;
                              auVar126._28_4_ = fVar131;
                              fStack_265c = local_2660;
                              fStack_2658 = local_2660;
                              fStack_2654 = local_2660;
                              fStack_2650 = local_2660;
                              fStack_264c = local_2660;
                              fStack_2648 = local_2660;
                              fStack_2644 = local_2660;
                              fVar129 = fVar127 - local_2660;
                              auVar134._4_4_ = fVar129;
                              auVar134._0_4_ = fVar129;
                              auVar134._8_4_ = fVar129;
                              auVar134._12_4_ = fVar129;
                              auVar134._16_4_ = fVar129;
                              auVar134._20_4_ = fVar129;
                              auVar134._24_4_ = fVar129;
                              auVar134._28_4_ = fVar129;
                              fStack_267c = local_2680;
                              fStack_2678 = local_2680;
                              fStack_2674 = local_2680;
                              fStack_2670 = local_2680;
                              fStack_266c = local_2680;
                              fStack_2668 = local_2680;
                              fStack_2664 = local_2680;
                              fVar130 = fVar128 - local_2680;
                              auVar142._4_4_ = fVar130;
                              auVar142._0_4_ = fVar130;
                              auVar142._8_4_ = fVar130;
                              auVar142._12_4_ = fVar130;
                              auVar142._16_4_ = fVar130;
                              auVar142._20_4_ = fVar130;
                              auVar142._24_4_ = fVar130;
                              auVar142._28_4_ = fVar130;
                              auVar78 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2ca0 - fVar125)))
                              ;
                              local_2c40._0_4_ = local_2c40._4_4_;
                              fStack_2c38 = (float)local_2c40._4_4_;
                              fStack_2c34 = (float)local_2c40._4_4_;
                              fStack_2c30 = (float)local_2c40._4_4_;
                              fStack_2c2c = (float)local_2c40._4_4_;
                              fStack_2c28 = (float)local_2c40._4_4_;
                              fStack_2c24 = (float)local_2c40._4_4_;
                              auVar79 = vbroadcastss_avx512vl
                                                  (ZEXT416((uint)((float)local_2c40._4_4_ - fVar127)
                                                          ));
                              fStack_2b9c = local_2ba0;
                              fStack_2b98 = local_2ba0;
                              fStack_2b94 = local_2ba0;
                              fStack_2b90 = local_2ba0;
                              fStack_2b8c = local_2ba0;
                              fStack_2b88 = local_2ba0;
                              fStack_2b84 = local_2ba0;
                              auVar80 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2ba0 - fVar128)))
                              ;
                              auVar63 = auVar80._0_16_;
                              fVar129 = fVar129 * (local_2ba0 - fVar128);
                              auVar119._4_4_ = fVar129;
                              auVar119._0_4_ = fVar129;
                              auVar119._8_4_ = fVar129;
                              auVar119._12_4_ = fVar129;
                              auVar119._16_4_ = fVar129;
                              auVar119._20_4_ = fVar129;
                              auVar119._24_4_ = fVar129;
                              auVar119._28_4_ = fVar129;
                              auVar81 = vfmsub231ps_avx512vl(auVar119,auVar79,auVar142);
                              fVar130 = fVar130 * (local_2ca0 - fVar125);
                              auVar120._4_4_ = fVar130;
                              auVar120._0_4_ = fVar130;
                              auVar120._8_4_ = fVar130;
                              auVar120._12_4_ = fVar130;
                              auVar120._16_4_ = fVar130;
                              auVar120._20_4_ = fVar130;
                              auVar120._24_4_ = fVar130;
                              auVar120._28_4_ = fVar130;
                              auVar82 = vfmsub231ps_avx512vl(auVar120,auVar80,auVar126);
                              fVar131 = ((float)local_2c40._4_4_ - fVar127) * fVar131;
                              auVar122._4_4_ = fVar131;
                              auVar122._0_4_ = fVar131;
                              auVar122._8_4_ = fVar131;
                              auVar122._12_4_ = fVar131;
                              auVar122._16_4_ = fVar131;
                              auVar122._20_4_ = fVar131;
                              auVar122._24_4_ = fVar131;
                              auVar122._28_4_ = fVar131;
                              auVar106 = ZEXT3264(*(undefined1 (*) [32])ray);
                              auVar108 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                              auVar113 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                              auVar69 = *(undefined1 (*) [32])(ray + 0x80);
                              auVar83 = vfmsub231ps_avx512vl(auVar122,auVar78,auVar134);
                              auVar70 = vsubps_avx(auVar96,*(undefined1 (*) [32])ray);
                              auVar72 = vsubps_avx(auVar115,*(undefined1 (*) [32])(ray + 0x20));
                              auVar73 = vsubps_avx(auVar123,*(undefined1 (*) [32])(ray + 0x40));
                              uVar8 = auVar73._28_4_;
                              auVar145 = ZEXT436(uVar8);
                              auVar144 = ZEXT436(uVar8);
                              auVar71 = *(undefined1 (*) [32])(ray + 0xa0);
                              auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                              auVar84 = vmulps_avx512vl(auVar71,auVar73);
                              auVar84 = vfmsub231ps_avx512vl(auVar84,auVar72,auVar74);
                              auVar85 = vmulps_avx512vl(auVar74,auVar70);
                              auVar85 = vfmsub231ps_avx512vl(auVar85,auVar73,auVar69);
                              auVar86 = vmulps_avx512vl(auVar69,auVar72);
                              auVar86 = vfmsub231ps_avx512vl(auVar86,auVar70,auVar71);
                              auVar80 = vmulps_avx512vl(auVar80,auVar86);
                              auVar79 = vfmadd231ps_avx512vl(auVar80,auVar85,auVar79);
                              auVar80 = vmulps_avx512vl(auVar83,auVar74);
                              auVar80 = vfmadd231ps_avx512vl(auVar80,auVar82,auVar71);
                              auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar69);
                              auVar78 = vfmadd231ps_avx512vl(auVar79,auVar84,auVar78);
                              vandps_avx512vl(auVar80,auVar149._0_32_);
                              auVar79 = vxorps_avx512vl(auVar78,auVar78);
                              uVar24 = vcmpps_avx512vl(auVar79,auVar150._0_32_,5);
                              bVar49 = (byte)uVar24 & bVar54;
                              fStack_2c9c = local_2ca0;
                              fStack_2c98 = local_2ca0;
                              fStack_2c94 = local_2ca0;
                              fStack_2c90 = local_2ca0;
                              fStack_2c8c = local_2ca0;
                              fStack_2c88 = local_2ca0;
                              fStack_2c84 = local_2ca0;
                              if (bVar49 != 0) {
                                auVar86 = vmulps_avx512vl(auVar142,auVar86);
                                auVar85 = vfmadd213ps_avx512vl(auVar85,auVar134,auVar86);
                                auVar84 = vfmadd213ps_avx512vl(auVar84,auVar126,auVar85);
                                auVar85 = vxorps_avx512vl(auVar78,auVar84);
                                uVar24 = vcmpps_avx512vl(auVar85,auVar150._0_32_,5);
                                bVar49 = bVar49 & (byte)uVar24;
                                if (bVar49 != 0) {
                                  vandps_avx512vl(auVar80,auVar146._0_32_);
                                  auVar86 = vsubps_avx(auVar85,auVar79);
                                  uVar24 = vcmpps_avx512vl(auVar86,auVar85,5);
                                  bVar49 = bVar49 & (byte)uVar24;
                                  if (bVar49 != 0) {
                                    local_2b40 = auVar77;
                                    local_2b20 = auVar76;
                                    local_2b00 = auVar75;
                                    local_2cc0 = vmovdqa64_avx512vl(auVar151._0_16_);
                                    local_2cb0 = vmovdqa64_avx512vl(auVar99._0_16_);
                                    auVar68 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
                                    auVar30._4_4_ = auVar83._4_4_ * auVar73._4_4_;
                                    auVar30._0_4_ = auVar83._0_4_ * auVar73._0_4_;
                                    auVar30._8_4_ = auVar83._8_4_ * auVar73._8_4_;
                                    auVar30._12_4_ = auVar83._12_4_ * auVar73._12_4_;
                                    auVar30._16_4_ = auVar83._16_4_ * auVar73._16_4_;
                                    auVar30._20_4_ = auVar83._20_4_ * auVar73._20_4_;
                                    auVar30._24_4_ = auVar83._24_4_ * auVar73._24_4_;
                                    auVar30._28_4_ = auVar86._28_4_;
                                    auVar65 = vfmadd213ps_fma(auVar72,auVar82,auVar30);
                                    auVar65 = vfmadd213ps_fma(auVar70,auVar81,ZEXT1632(auVar65));
                                    auVar70 = vxorps_avx512vl(auVar78,ZEXT1632(auVar65));
                                    fVar125 = auVar85._0_4_;
                                    auVar140._0_4_ = fVar125 * *(float *)(ray + 0x60);
                                    fVar127 = auVar85._4_4_;
                                    auVar140._4_4_ = fVar127 * *(float *)(ray + 100);
                                    fVar128 = auVar85._8_4_;
                                    auVar140._8_4_ = fVar128 * *(float *)(ray + 0x68);
                                    fVar129 = auVar85._12_4_;
                                    auVar140._12_4_ = fVar129 * *(float *)(ray + 0x6c);
                                    fVar130 = auVar85._16_4_;
                                    auVar140._16_4_ = fVar130 * *(float *)(ray + 0x70);
                                    fVar131 = auVar85._20_4_;
                                    auVar140._20_4_ = fVar131 * *(float *)(ray + 0x74);
                                    fVar132 = auVar85._24_4_;
                                    auVar140._24_4_ = fVar132 * *(float *)(ray + 0x78);
                                    auVar140._28_4_ = 0;
                                    local_2ae0 = *(float *)(ray + 0x100);
                                    fStack_2adc = *(float *)(ray + 0x104);
                                    fStack_2ad8 = *(float *)(ray + 0x108);
                                    fStack_2ad4 = *(float *)(ray + 0x10c);
                                    fStack_2ad0 = *(float *)(ray + 0x110);
                                    fStack_2acc = *(float *)(ray + 0x114);
                                    fStack_2ac8 = *(float *)(ray + 0x118);
                                    iStack_2ac4 = *(int *)(ray + 0x11c);
                                    auVar31._4_4_ = fVar127 * fStack_2adc;
                                    auVar31._0_4_ = fVar125 * local_2ae0;
                                    auVar31._8_4_ = fVar128 * fStack_2ad8;
                                    auVar31._12_4_ = fVar129 * fStack_2ad4;
                                    auVar31._16_4_ = fVar130 * fStack_2ad0;
                                    auVar31._20_4_ = fVar131 * fStack_2acc;
                                    auVar31._24_4_ = fVar132 * fStack_2ac8;
                                    auVar31._28_4_ = iStack_2ac4;
                                    uVar24 = vcmpps_avx512vl(auVar70,auVar31,2);
                                    uVar25 = vcmpps_avx512vl(auVar140,auVar70,1);
                                    bVar49 = bVar49 & (byte)uVar24 & (byte)uVar25;
                                    if (bVar49 == 0) {
LAB_00714ded:
                                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar68 = vxorps_avx512vl(auVar64,auVar64);
                                      auVar64 = vmovdqa64_avx512vl(local_2cb0);
                                      auVar65 = vmovdqa64_avx512vl(local_2cc0);
                                      auVar144 = ZEXT436(uVar8);
                                    }
                                    else {
                                      uVar24 = vcmpps_avx512vl(auVar80,ZEXT1632(auVar68),4);
                                      bVar49 = bVar49 & (byte)uVar24;
                                      if (bVar49 == 0) goto LAB_00714ded;
                                      local_2c80 = (context->scene->geometries).items
                                                   [*(uint *)(local_2bb0 + uVar62 * 4)].ptr;
                                      uVar5 = local_2c80->mask;
                                      auVar141._4_4_ = uVar5;
                                      auVar141._0_4_ = uVar5;
                                      auVar141._8_4_ = uVar5;
                                      auVar141._12_4_ = uVar5;
                                      auVar141._16_4_ = uVar5;
                                      auVar141._20_4_ = uVar5;
                                      auVar141._24_4_ = uVar5;
                                      auVar141._28_4_ = uVar5;
                                      uVar24 = vptestmd_avx512vl(auVar141,*(undefined1 (*) [32])
                                                                           (ray + 0x120));
                                      bVar46 = (byte)uVar24 & bVar49;
                                      if (bVar46 == 0) goto LAB_00714ded;
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (local_2c80->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                      {
                                        auVar88 = auVar146._0_16_;
                                        auVar65 = vcvtsi2ss_avx512f(auVar88,*(ushort *)
                                                                             (local_2bf0 + 8 +
                                                                             local_2bf8) - 1);
                                        auVar68 = vcvtsi2ss_avx512f(auVar88,*(ushort *)
                                                                             (local_2bf0 + 10 +
                                                                             local_2bf8) - 1);
                                        auVar67 = vcvtsi2ss_avx512f(auVar88,((uint)uVar62 & 1) +
                                                                            local_2cc4);
                                        auVar88 = vcvtsi2ss_avx512f(auVar88,((uint)(uVar62 >> 1) &
                                                                            0x7fffffff) + local_2cc8
                                                                   );
                                        local_2a00 = vpbroadcastd_avx512vl();
                                        auVar114._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4)
                                        ;
                                        auVar114._0_4_ = auVar65._0_4_;
                                        auVar66 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar114);
                                        auVar65 = vfnmadd213ss_fma(auVar65,auVar66,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar133 = auVar66._0_4_ * auVar65._0_4_;
                                        fVar100 = auVar67._0_4_;
                                        auVar105._0_4_ = auVar79._0_4_ + fVar125 * fVar100;
                                        auVar105._4_4_ = auVar79._4_4_ + fVar127 * fVar100;
                                        auVar105._8_4_ = auVar79._8_4_ + fVar128 * fVar100;
                                        auVar105._12_4_ = auVar79._12_4_ + fVar129 * fVar100;
                                        auVar105._16_4_ = auVar79._16_4_ + fVar130 * fVar100;
                                        auVar105._20_4_ = auVar79._20_4_ + fVar131 * fVar100;
                                        auVar105._24_4_ = auVar79._24_4_ + fVar132 * fVar100;
                                        auVar105._28_4_ = auVar79._28_4_ + fVar100;
                                        auVar91._4_4_ = fVar133;
                                        auVar91._0_4_ = fVar133;
                                        auVar91._8_4_ = fVar133;
                                        auVar91._12_4_ = fVar133;
                                        auVar91._16_4_ = fVar133;
                                        auVar91._20_4_ = fVar133;
                                        auVar91._24_4_ = fVar133;
                                        auVar91._28_4_ = fVar133;
                                        auVar69 = vmulps_avx512vl(auVar105,auVar91);
                                        bVar61 = (bool)(bVar49 >> 1 & 1);
                                        bVar14 = (bool)(bVar49 >> 2 & 1);
                                        bVar16 = (bool)(bVar49 >> 3 & 1);
                                        bVar20 = (bool)(bVar49 >> 4 & 1);
                                        bVar18 = (bool)(bVar49 >> 5 & 1);
                                        bVar21 = (bool)(bVar49 >> 6 & 1);
                                        auVar90._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
                                        auVar90._0_4_ = auVar68._0_4_;
                                        auVar67 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar90);
                                        auVar65 = vfnmadd213ss_fma(auVar68,auVar67,
                                                                   SUB6416(ZEXT464(0x40000000),0));
                                        fVar133 = auVar67._0_4_ * auVar65._0_4_;
                                        fVar100 = auVar88._0_4_;
                                        auVar98._0_4_ = fVar125 + fVar125 * fVar100;
                                        auVar98._4_4_ = fVar127 + fVar127 * fVar100;
                                        auVar98._8_4_ = fVar128 + fVar128 * fVar100;
                                        auVar98._12_4_ = fVar129 + fVar129 * fVar100;
                                        auVar98._16_4_ = fVar130 + fVar130 * fVar100;
                                        auVar98._20_4_ = fVar131 + fVar131 * fVar100;
                                        auVar98._24_4_ = fVar132 + fVar132 * fVar100;
                                        auVar98._28_4_ = auVar85._28_4_ + fVar100;
                                        auVar92._4_4_ = fVar133;
                                        auVar92._0_4_ = fVar133;
                                        auVar92._8_4_ = fVar133;
                                        auVar92._12_4_ = fVar133;
                                        auVar92._16_4_ = fVar133;
                                        auVar92._20_4_ = fVar133;
                                        auVar92._24_4_ = fVar133;
                                        auVar92._28_4_ = fVar133;
                                        auVar71 = vmulps_avx512vl(auVar98,auVar92);
                                        bVar13 = (bool)(bVar49 >> 1 & 1);
                                        bVar15 = (bool)(bVar49 >> 2 & 1);
                                        bVar17 = (bool)(bVar49 >> 3 & 1);
                                        bVar23 = (bool)(bVar49 >> 4 & 1);
                                        bVar19 = (bool)(bVar49 >> 5 & 1);
                                        bVar22 = (bool)(bVar49 >> 6 & 1);
                                        auVar74 = vrcp14ps_avx512vl(auVar85);
                                        auVar29._8_4_ = 0x3f800000;
                                        auVar29._0_8_ = 0x3f8000003f800000;
                                        auVar29._12_4_ = 0x3f800000;
                                        auVar29._16_4_ = 0x3f800000;
                                        auVar29._20_4_ = 0x3f800000;
                                        auVar29._24_4_ = 0x3f800000;
                                        auVar29._28_4_ = 0x3f800000;
                                        auVar72 = vfnmadd213ps_avx512vl(auVar85,auVar74,auVar29);
                                        auVar65 = vfmadd132ps_fma(auVar72,auVar74,auVar74);
                                        local_2a60._4_4_ =
                                             (float)((uint)bVar61 * auVar69._4_4_ |
                                                    (uint)!bVar61 * (int)auVar79._4_4_) *
                                             auVar65._4_4_;
                                        local_2a60._0_4_ =
                                             (float)((uint)(bVar49 & 1) * auVar69._0_4_ |
                                                    (uint)!(bool)(bVar49 & 1) * (int)auVar79._0_4_)
                                             * auVar65._0_4_;
                                        fStack_2a58 = (float)((uint)bVar14 * auVar69._8_4_ |
                                                             (uint)!bVar14 * (int)auVar79._8_4_) *
                                                      auVar65._8_4_;
                                        fStack_2a54 = (float)((uint)bVar16 * auVar69._12_4_ |
                                                             (uint)!bVar16 * (int)auVar79._12_4_) *
                                                      auVar65._12_4_;
                                        fStack_2a50 = (float)((uint)bVar20 * auVar69._16_4_ |
                                                             (uint)!bVar20 * (int)auVar79._16_4_) *
                                                      0.0;
                                        fStack_2a4c = (float)((uint)bVar18 * auVar69._20_4_ |
                                                             (uint)!bVar18 * (int)auVar79._20_4_) *
                                                      0.0;
                                        fStack_2a48 = (float)((uint)bVar21 * auVar69._24_4_ |
                                                             (uint)!bVar21 * (int)auVar79._24_4_) *
                                                      0.0;
                                        uStack_2a44 = auVar74._28_4_;
                                        local_2a20 = vpbroadcastd_avx512vl();
                                        pRVar12 = context->user;
                                        local_2ac0[0] = (RTCHitN)auVar81[0];
                                        local_2ac0[1] = (RTCHitN)auVar81[1];
                                        local_2ac0[2] = (RTCHitN)auVar81[2];
                                        local_2ac0[3] = (RTCHitN)auVar81[3];
                                        local_2ac0[4] = (RTCHitN)auVar81[4];
                                        local_2ac0[5] = (RTCHitN)auVar81[5];
                                        local_2ac0[6] = (RTCHitN)auVar81[6];
                                        local_2ac0[7] = (RTCHitN)auVar81[7];
                                        local_2ac0[8] = (RTCHitN)auVar81[8];
                                        local_2ac0[9] = (RTCHitN)auVar81[9];
                                        local_2ac0[10] = (RTCHitN)auVar81[10];
                                        local_2ac0[0xb] = (RTCHitN)auVar81[0xb];
                                        local_2ac0[0xc] = (RTCHitN)auVar81[0xc];
                                        local_2ac0[0xd] = (RTCHitN)auVar81[0xd];
                                        local_2ac0[0xe] = (RTCHitN)auVar81[0xe];
                                        local_2ac0[0xf] = (RTCHitN)auVar81[0xf];
                                        local_2ac0[0x10] = (RTCHitN)auVar81[0x10];
                                        local_2ac0[0x11] = (RTCHitN)auVar81[0x11];
                                        local_2ac0[0x12] = (RTCHitN)auVar81[0x12];
                                        local_2ac0[0x13] = (RTCHitN)auVar81[0x13];
                                        local_2ac0[0x14] = (RTCHitN)auVar81[0x14];
                                        local_2ac0[0x15] = (RTCHitN)auVar81[0x15];
                                        local_2ac0[0x16] = (RTCHitN)auVar81[0x16];
                                        local_2ac0[0x17] = (RTCHitN)auVar81[0x17];
                                        local_2ac0[0x18] = (RTCHitN)auVar81[0x18];
                                        local_2ac0[0x19] = (RTCHitN)auVar81[0x19];
                                        local_2ac0[0x1a] = (RTCHitN)auVar81[0x1a];
                                        local_2ac0[0x1b] = (RTCHitN)auVar81[0x1b];
                                        local_2ac0[0x1c] = (RTCHitN)auVar81[0x1c];
                                        local_2ac0[0x1d] = (RTCHitN)auVar81[0x1d];
                                        local_2ac0[0x1e] = (RTCHitN)auVar81[0x1e];
                                        local_2ac0[0x1f] = (RTCHitN)auVar81[0x1f];
                                        local_2aa0 = auVar82;
                                        local_2a80 = auVar83;
                                        local_2a40._4_4_ =
                                             (float)((uint)bVar13 * auVar71._4_4_ |
                                                    (uint)!bVar13 * (int)fVar127) * auVar65._4_4_;
                                        local_2a40._0_4_ =
                                             (float)((uint)(bVar49 & 1) * auVar71._0_4_ |
                                                    (uint)!(bool)(bVar49 & 1) * (int)fVar125) *
                                             auVar65._0_4_;
                                        fStack_2a38 = (float)((uint)bVar15 * auVar71._8_4_ |
                                                             (uint)!bVar15 * (int)fVar128) *
                                                      auVar65._8_4_;
                                        fStack_2a34 = (float)((uint)bVar17 * auVar71._12_4_ |
                                                             (uint)!bVar17 * (int)fVar129) *
                                                      auVar65._12_4_;
                                        fStack_2a30 = (float)((uint)bVar23 * auVar71._16_4_ |
                                                             (uint)!bVar23 * (int)fVar130) * 0.0;
                                        fStack_2a2c = (float)((uint)bVar19 * auVar71._20_4_ |
                                                             (uint)!bVar19 * (int)fVar131) * 0.0;
                                        fStack_2a28 = (float)((uint)bVar22 * auVar71._24_4_ |
                                                             (uint)!bVar22 * (int)fVar132) * 0.0;
                                        fStack_2a24 = auVar98._28_4_;
                                        auVar69 = vpcmpeqd_avx2(_local_2a60,_local_2a60);
                                        local_2c08[1] = auVar69;
                                        *local_2c08 = auVar69;
                                        local_29e0 = pRVar12->instID[0];
                                        uStack_29dc = local_29e0;
                                        uStack_29d8 = local_29e0;
                                        uStack_29d4 = local_29e0;
                                        uStack_29d0 = local_29e0;
                                        uStack_29cc = local_29e0;
                                        uStack_29c8 = local_29e0;
                                        uStack_29c4 = local_29e0;
                                        local_29c0 = pRVar12->instPrimID[0];
                                        uStack_29bc = local_29c0;
                                        uStack_29b8 = local_29c0;
                                        uStack_29b4 = local_29c0;
                                        uStack_29b0 = local_29c0;
                                        uStack_29ac = local_29c0;
                                        uStack_29a8 = local_29c0;
                                        uStack_29a4 = local_29c0;
                                        auVar69 = vmulps_avx512vl(ZEXT1632(auVar65),auVar70);
                                        bVar61 = (bool)(bVar46 >> 1 & 1);
                                        bVar13 = (bool)(bVar46 >> 2 & 1);
                                        bVar14 = (bool)(bVar46 >> 3 & 1);
                                        bVar15 = (bool)(bVar46 >> 4 & 1);
                                        bVar16 = (bool)(bVar46 >> 5 & 1);
                                        bVar17 = (bool)(bVar46 >> 6 & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar46 & 1) * auVar69._0_4_ |
                                             (uint)!(bool)(bVar46 & 1) * (int)local_2ae0;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar61 * auVar69._4_4_ |
                                             (uint)!bVar61 * (int)fStack_2adc;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar13 * auVar69._8_4_ |
                                             (uint)!bVar13 * (int)fStack_2ad8;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar14 * auVar69._12_4_ |
                                             (uint)!bVar14 * (int)fStack_2ad4;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar15 * auVar69._16_4_ |
                                             (uint)!bVar15 * (int)fStack_2ad0;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar16 * auVar69._20_4_ |
                                             (uint)!bVar16 * (int)fStack_2acc;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar17 * auVar69._24_4_ |
                                             (uint)!bVar17 * (int)fStack_2ac8;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)(bVar46 >> 7) * auVar69._28_4_ |
                                             (uint)!(bool)(bVar46 >> 7) * iStack_2ac4;
                                        local_2be0 = vpmovm2d_avx512vl((ulong)bVar46);
                                        local_2c70.geometryUserPtr = local_2c80->userPtr;
                                        local_2c70.valid = (int *)local_2be0;
                                        local_2c70.context = context->user;
                                        local_2c70.ray = (RTCRayN *)ray;
                                        local_2c70.hit = local_2ac0;
                                        local_2c70.N = 8;
                                        auVar145 = ZEXT436(uVar8);
                                        if (local_2c80->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                        {
                                          auVar145 = (undefined1  [36])0x0;
                                          (*local_2c80->occlusionFilterN)(&local_2c70);
                                        }
                                        if (local_2be0 == (undefined1  [32])0x0) {
                                          uVar53 = 0;
                                        }
                                        else {
                                          p_Var11 = context->args->filter;
                                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((local_2c80->field_8).field_0x2 & 0x40) != 0)))) {
                                            auVar145 = (undefined1  [36])0x0;
                                            (*p_Var11)(&local_2c70);
                                          }
                                          uVar53 = vptestmd_avx512vl(local_2be0,local_2be0);
                                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar61 = (bool)((byte)uVar53 & 1);
                                          bVar13 = (bool)((byte)(uVar53 >> 1) & 1);
                                          bVar14 = (bool)((byte)(uVar53 >> 2) & 1);
                                          bVar15 = (bool)((byte)(uVar53 >> 3) & 1);
                                          bVar16 = (bool)((byte)(uVar53 >> 4) & 1);
                                          bVar17 = (bool)((byte)(uVar53 >> 5) & 1);
                                          bVar20 = (bool)((byte)(uVar53 >> 6) & 1);
                                          bVar23 = SUB81(uVar53 >> 7,0);
                                          *(uint *)(local_2c70.ray + 0x100) =
                                               (uint)bVar61 * auVar69._0_4_ |
                                               (uint)!bVar61 * *(int *)(local_2c70.ray + 0x100);
                                          *(uint *)(local_2c70.ray + 0x104) =
                                               (uint)bVar13 * auVar69._4_4_ |
                                               (uint)!bVar13 * *(int *)(local_2c70.ray + 0x104);
                                          *(uint *)(local_2c70.ray + 0x108) =
                                               (uint)bVar14 * auVar69._8_4_ |
                                               (uint)!bVar14 * *(int *)(local_2c70.ray + 0x108);
                                          *(uint *)(local_2c70.ray + 0x10c) =
                                               (uint)bVar15 * auVar69._12_4_ |
                                               (uint)!bVar15 * *(int *)(local_2c70.ray + 0x10c);
                                          *(uint *)(local_2c70.ray + 0x110) =
                                               (uint)bVar16 * auVar69._16_4_ |
                                               (uint)!bVar16 * *(int *)(local_2c70.ray + 0x110);
                                          *(uint *)(local_2c70.ray + 0x114) =
                                               (uint)bVar17 * auVar69._20_4_ |
                                               (uint)!bVar17 * *(int *)(local_2c70.ray + 0x114);
                                          *(uint *)(local_2c70.ray + 0x118) =
                                               (uint)bVar20 * auVar69._24_4_ |
                                               (uint)!bVar20 * *(int *)(local_2c70.ray + 0x118);
                                          *(uint *)(local_2c70.ray + 0x11c) =
                                               (uint)bVar23 * auVar69._28_4_ |
                                               (uint)!bVar23 * *(int *)(local_2c70.ray + 0x11c);
                                        }
                                        bVar46 = (byte)uVar53;
                                        bVar61 = (bool)((byte)(uVar53 >> 1) & 1);
                                        bVar13 = (bool)((byte)(uVar53 >> 2) & 1);
                                        bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
                                        bVar15 = (bool)((byte)(uVar53 >> 4) & 1);
                                        bVar16 = (bool)((byte)(uVar53 >> 5) & 1);
                                        bVar17 = (bool)((byte)(uVar53 >> 6) & 1);
                                        bVar20 = (bool)((byte)(uVar53 >> 7) & 1);
                                        *(uint *)(ray + 0x100) =
                                             (uint)(bVar46 & 1) * *(int *)(ray + 0x100) |
                                             (uint)!(bool)(bVar46 & 1) * (int)local_2ae0;
                                        *(uint *)(ray + 0x104) =
                                             (uint)bVar61 * *(int *)(ray + 0x104) |
                                             (uint)!bVar61 * (int)fStack_2adc;
                                        *(uint *)(ray + 0x108) =
                                             (uint)bVar13 * *(int *)(ray + 0x108) |
                                             (uint)!bVar13 * (int)fStack_2ad8;
                                        *(uint *)(ray + 0x10c) =
                                             (uint)bVar14 * *(int *)(ray + 0x10c) |
                                             (uint)!bVar14 * (int)fStack_2ad4;
                                        *(uint *)(ray + 0x110) =
                                             (uint)bVar15 * *(int *)(ray + 0x110) |
                                             (uint)!bVar15 * (int)fStack_2ad0;
                                        *(uint *)(ray + 0x114) =
                                             (uint)bVar16 * *(int *)(ray + 0x114) |
                                             (uint)!bVar16 * (int)fStack_2acc;
                                        *(uint *)(ray + 0x118) =
                                             (uint)bVar17 * *(int *)(ray + 0x118) |
                                             (uint)!bVar17 * (int)fStack_2ac8;
                                        *(uint *)(ray + 0x11c) =
                                             (uint)bVar20 * *(int *)(ray + 0x11c) |
                                             (uint)!bVar20 * iStack_2ac4;
                                        auVar106 = ZEXT3264(*(undefined1 (*) [32])ray);
                                        auVar108 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                                        auVar113 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                                        auVar69 = *(undefined1 (*) [32])(ray + 0x80);
                                        auVar71 = *(undefined1 (*) [32])(ray + 0xa0);
                                        auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                                      }
                                      bVar54 = bVar54 & ~bVar46;
                                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar70 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                      auVar68 = vxorps_avx512vl(auVar64,auVar64);
                                      auVar64 = vmovdqa64_avx512vl(local_2cb0);
                                      auVar65 = vmovdqa64_avx512vl(local_2cc0);
                                      auVar144 = auVar145;
                                    }
                                    auVar151 = ZEXT1664(auVar65);
                                    auVar99 = ZEXT1664(auVar64);
                                    auVar150 = ZEXT1664(auVar68);
                                    auVar149 = ZEXT3264(auVar73);
                                    auVar148 = ZEXT3264(auVar72);
                                    auVar147 = ZEXT3264(auVar70);
                                    auVar146 = ZEXT3264(auVar75);
                                    auVar75 = local_2b00;
                                    auVar76 = local_2b20;
                                    auVar77 = local_2b40;
                                  }
                                }
                              }
                              auVar88 = auVar150._0_16_;
                              auVar37._4_4_ = fStack_2c9c;
                              auVar37._0_4_ = local_2ca0;
                              auVar37._8_4_ = fStack_2c98;
                              auVar37._12_4_ = fStack_2c94;
                              auVar37._16_4_ = fStack_2c90;
                              auVar37._20_4_ = fStack_2c8c;
                              auVar37._24_4_ = fStack_2c88;
                              auVar37._28_4_ = fStack_2c84;
                              auVar38._4_4_ = fStack_2b9c;
                              auVar38._0_4_ = local_2ba0;
                              auVar38._8_4_ = fStack_2b98;
                              auVar38._12_4_ = fStack_2b94;
                              auVar38._16_4_ = fStack_2b90;
                              auVar38._20_4_ = fStack_2b8c;
                              auVar38._24_4_ = fStack_2b88;
                              auVar38._28_4_ = fStack_2b84;
                              auVar70 = vsubps_avx512vl(auVar75,auVar37);
                              auVar72 = vsubps_avx512vl(auVar76,_local_2c40);
                              auVar73 = vsubps_avx512vl(auVar77,auVar38);
                              auVar44._4_4_ = fStack_263c;
                              auVar44._0_4_ = local_2640;
                              auVar44._8_4_ = fStack_2638;
                              auVar44._12_4_ = fStack_2634;
                              auVar44._16_4_ = fStack_2630;
                              auVar44._20_4_ = fStack_262c;
                              auVar44._24_4_ = fStack_2628;
                              auVar44._28_4_ = fStack_2624;
                              auVar78 = vsubps_avx512vl(auVar44,auVar75);
                              auVar43._4_4_ = fStack_265c;
                              auVar43._0_4_ = local_2660;
                              auVar43._8_4_ = fStack_2658;
                              auVar43._12_4_ = fStack_2654;
                              auVar43._16_4_ = fStack_2650;
                              auVar43._20_4_ = fStack_264c;
                              auVar43._24_4_ = fStack_2648;
                              auVar43._28_4_ = fStack_2644;
                              auVar79 = vsubps_avx512vl(auVar43,auVar76);
                              auVar42._4_4_ = fStack_267c;
                              auVar42._0_4_ = local_2680;
                              auVar42._8_4_ = fStack_2678;
                              auVar42._12_4_ = fStack_2674;
                              auVar42._16_4_ = fStack_2670;
                              auVar42._20_4_ = fStack_266c;
                              auVar42._24_4_ = fStack_2668;
                              auVar42._28_4_ = fStack_2664;
                              auVar80 = vsubps_avx512vl(auVar42,auVar77);
                              auVar81 = vmulps_avx512vl(auVar72,auVar80);
                              auVar81 = vfmsub231ps_avx512vl(auVar81,auVar79,auVar73);
                              auVar82 = vmulps_avx512vl(auVar73,auVar78);
                              auVar82 = vfmsub231ps_avx512vl(auVar82,auVar80,auVar70);
                              auVar83 = vmulps_avx512vl(auVar70,auVar79);
                              auVar83 = vfmsub231ps_avx512vl(auVar83,auVar78,auVar72);
                              auVar75 = vsubps_avx512vl(auVar75,auVar106._0_32_);
                              auVar76 = vsubps_avx512vl(auVar76,auVar108._0_32_);
                              auVar77 = vsubps_avx512vl(auVar77,auVar113._0_32_);
                              fVar133 = auVar77._0_4_;
                              auVar107._0_4_ = fVar133 * auVar71._0_4_;
                              fVar100 = auVar77._4_4_;
                              auVar107._4_4_ = fVar100 * auVar71._4_4_;
                              fVar135 = auVar77._8_4_;
                              auVar107._8_4_ = fVar135 * auVar71._8_4_;
                              fVar136 = auVar77._12_4_;
                              auVar107._12_4_ = fVar136 * auVar71._12_4_;
                              fVar137 = auVar77._16_4_;
                              auVar107._16_4_ = fVar137 * auVar71._16_4_;
                              fVar138 = auVar77._20_4_;
                              auVar107._20_4_ = fVar138 * auVar71._20_4_;
                              auVar107._28_36_ = auVar106._28_36_;
                              fVar139 = auVar77._24_4_;
                              auVar107._24_4_ = fVar139 * auVar71._24_4_;
                              auVar65 = vfmsub231ps_fma(auVar107._0_32_,auVar76,auVar74);
                              auVar106._0_4_ = auVar75._0_4_ * auVar74._0_4_;
                              auVar106._4_4_ = auVar75._4_4_ * auVar74._4_4_;
                              auVar106._8_4_ = auVar75._8_4_ * auVar74._8_4_;
                              auVar106._12_4_ = auVar75._12_4_ * auVar74._12_4_;
                              auVar106._16_4_ = auVar75._16_4_ * auVar74._16_4_;
                              auVar106._20_4_ = auVar75._20_4_ * auVar74._20_4_;
                              auVar106._28_36_ = auVar108._28_36_;
                              auVar106._24_4_ = auVar75._24_4_ * auVar74._24_4_;
                              auVar68 = vfmsub231ps_fma(auVar106._0_32_,auVar77,auVar69);
                              auVar143._0_4_ = auVar76._0_4_ * auVar69._0_4_;
                              auVar143._4_4_ = auVar76._4_4_ * auVar69._4_4_;
                              auVar143._8_4_ = auVar76._8_4_ * auVar69._8_4_;
                              auVar143._12_4_ = auVar76._12_4_ * auVar69._12_4_;
                              auVar143._16_4_ = auVar76._16_4_ * auVar69._16_4_;
                              auVar143._20_4_ = auVar76._20_4_ * auVar69._20_4_;
                              auVar143._24_4_ = auVar76._24_4_ * auVar69._24_4_;
                              auVar143._28_36_ = auVar144;
                              auVar67 = vfmsub231ps_fma(auVar143._0_32_,auVar75,auVar71);
                              auVar108._0_4_ = auVar83._0_4_ * auVar74._0_4_;
                              auVar108._4_4_ = auVar83._4_4_ * auVar74._4_4_;
                              auVar108._8_4_ = auVar83._8_4_ * auVar74._8_4_;
                              auVar108._12_4_ = auVar83._12_4_ * auVar74._12_4_;
                              auVar108._16_4_ = auVar83._16_4_ * auVar74._16_4_;
                              auVar108._20_4_ = auVar83._20_4_ * auVar74._20_4_;
                              auVar108._28_36_ = auVar113._28_36_;
                              auVar108._24_4_ = auVar83._24_4_ * auVar74._24_4_;
                              auVar64 = vfmadd231ps_fma(auVar108._0_32_,auVar82,auVar71);
                              auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar81,auVar69);
                              vandps_avx512vl(ZEXT1632(auVar64),auVar149._0_32_);
                              auVar69 = vmulps_avx512vl(auVar80,ZEXT1632(auVar67));
                              auVar69 = vfmadd231ps_avx512vl(auVar69,ZEXT1632(auVar68),auVar79);
                              auVar69 = vfmadd231ps_avx512vl(auVar69,ZEXT1632(auVar65),auVar78);
                              fVar125 = auVar69._0_4_;
                              auVar116._0_4_ = (uint)fVar133 ^ (uint)fVar125;
                              fVar127 = auVar69._4_4_;
                              auVar116._4_4_ = (uint)fVar100 ^ (uint)fVar127;
                              fVar128 = auVar69._8_4_;
                              auVar116._8_4_ = (uint)fVar135 ^ (uint)fVar128;
                              fVar129 = auVar69._12_4_;
                              auVar116._12_4_ = (uint)fVar136 ^ (uint)fVar129;
                              fVar130 = auVar69._16_4_;
                              auVar116._16_4_ = (uint)fVar137 ^ (uint)fVar130;
                              fVar131 = auVar69._20_4_;
                              auVar116._20_4_ = (uint)fVar138 ^ (uint)fVar131;
                              fVar132 = auVar69._24_4_;
                              auVar116._24_4_ = (uint)fVar139 ^ (uint)fVar132;
                              auVar97._28_4_ = auVar77._28_4_;
                              auVar116._28_4_ = auVar97._28_4_ ^ auVar69._28_4_;
                              uVar24 = vcmpps_avx512vl(auVar116,auVar150._0_32_,5);
                              bVar49 = (byte)uVar24 & bVar54;
                              if (bVar49 != 0) {
                                auVar32._4_4_ = auVar73._4_4_ * auVar67._4_4_;
                                auVar32._0_4_ = auVar73._0_4_ * auVar67._0_4_;
                                auVar32._8_4_ = auVar73._8_4_ * auVar67._8_4_;
                                auVar32._12_4_ = auVar73._12_4_ * auVar67._12_4_;
                                auVar32._16_4_ = auVar73._16_4_ * 0.0;
                                auVar32._20_4_ = auVar73._20_4_ * 0.0;
                                auVar32._24_4_ = auVar73._24_4_ * 0.0;
                                auVar32._28_4_ = auVar69._28_4_;
                                auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar72,auVar32);
                                auVar65 = vfmadd213ps_fma(ZEXT1632(auVar65),auVar70,
                                                          ZEXT1632(auVar68));
                                auVar104._0_4_ = (uint)fVar133 ^ auVar65._0_4_;
                                auVar104._4_4_ = (uint)fVar100 ^ auVar65._4_4_;
                                auVar104._8_4_ = (uint)fVar135 ^ auVar65._8_4_;
                                auVar104._12_4_ = (uint)fVar136 ^ auVar65._12_4_;
                                auVar104._16_4_ = fVar137;
                                auVar104._20_4_ = fVar138;
                                auVar104._24_4_ = fVar139;
                                auVar104._28_4_ = auVar97._28_4_;
                                uVar24 = vcmpps_avx512vl(auVar104,auVar150._0_32_,5);
                                bVar49 = bVar49 & (byte)uVar24;
                                if (bVar49 != 0) {
                                  vandps_avx512vl(ZEXT1632(auVar64),auVar146._0_32_);
                                  auVar71 = vsubps_avx(auVar69,auVar116);
                                  uVar24 = vcmpps_avx512vl(auVar71,auVar104,5);
                                  bVar49 = bVar49 & (byte)uVar24;
                                  if (bVar49 != 0) {
                                    local_2cc0 = vmovdqa64_avx512vl(auVar151._0_16_);
                                    local_2cb0 = vmovdqa64_avx512vl(auVar99._0_16_);
                                    auVar33._4_4_ = auVar83._4_4_ * fVar100;
                                    auVar33._0_4_ = auVar83._0_4_ * fVar133;
                                    auVar33._8_4_ = auVar83._8_4_ * fVar135;
                                    auVar33._12_4_ = auVar83._12_4_ * fVar136;
                                    auVar33._16_4_ = auVar83._16_4_ * fVar137;
                                    auVar33._20_4_ = auVar83._20_4_ * fVar138;
                                    auVar33._24_4_ = auVar83._24_4_ * fVar139;
                                    auVar33._28_4_ = auVar116._28_4_;
                                    auVar65 = vfmadd213ps_fma(auVar76,auVar82,auVar33);
                                    auVar65 = vfmadd213ps_fma(auVar75,auVar81,ZEXT1632(auVar65));
                                    auVar97._0_4_ = auVar65._0_4_ ^ (uint)fVar133;
                                    auVar97._4_4_ = auVar65._4_4_ ^ (uint)fVar100;
                                    auVar97._8_4_ = auVar65._8_4_ ^ (uint)fVar135;
                                    auVar97._12_4_ = auVar65._12_4_ ^ (uint)fVar136;
                                    auVar97._16_4_ = fVar137;
                                    auVar97._20_4_ = fVar138;
                                    auVar97._24_4_ = fVar139;
                                    auVar34._4_4_ = fVar127 * *(float *)(ray + 100);
                                    auVar34._0_4_ = fVar125 * *(float *)(ray + 0x60);
                                    auVar34._8_4_ = fVar128 * *(float *)(ray + 0x68);
                                    auVar34._12_4_ = fVar129 * *(float *)(ray + 0x6c);
                                    auVar34._16_4_ = fVar130 * *(float *)(ray + 0x70);
                                    auVar34._20_4_ = fVar131 * *(float *)(ray + 0x74);
                                    auVar34._24_4_ = fVar132 * *(float *)(ray + 0x78);
                                    auVar34._28_4_ = auVar116._28_4_;
                                    pRVar1 = ray + 0x100;
                                    auVar45 = *(undefined1 (*) [28])pRVar1;
                                    iVar47 = *(int *)(ray + 0x11c);
                                    _local_2c40 = *(undefined1 (*) [32])pRVar1;
                                    auVar74 = _local_2c40;
                                    auVar35._4_4_ = *(float *)(ray + 0x104) * fVar127;
                                    auVar35._0_4_ = *(float *)pRVar1 * fVar125;
                                    auVar35._8_4_ = *(float *)(ray + 0x108) * fVar128;
                                    auVar35._12_4_ = *(float *)(ray + 0x10c) * fVar129;
                                    auVar35._16_4_ = *(float *)(ray + 0x110) * fVar130;
                                    auVar35._20_4_ = *(float *)(ray + 0x114) * fVar131;
                                    auVar35._24_4_ = *(float *)(ray + 0x118) * fVar132;
                                    auVar35._28_4_ = iVar47;
                                    uVar24 = vcmpps_avx512vl(auVar97,auVar35,2);
                                    uVar25 = vcmpps_avx512vl(auVar34,auVar97,1);
                                    bVar49 = bVar49 & (byte)uVar24 & (byte)uVar25;
                                    if (bVar49 != 0) {
                                      uVar24 = vcmpps_avx512vl(ZEXT1632(auVar64),ZEXT832(0) << 0x20,
                                                               4);
                                      bVar49 = bVar49 & (byte)uVar24;
                                      if (bVar49 != 0) {
                                        pGVar9 = (context->scene->geometries).items
                                                 [*(uint *)(local_2bb0 + uVar62 * 4)].ptr;
                                        local_2ca0 = SUB84(pGVar9,0);
                                        fStack_2c9c = (float)((ulong)pGVar9 >> 0x20);
                                        uVar8 = pGVar9->mask;
                                        auVar110._4_4_ = uVar8;
                                        auVar110._0_4_ = uVar8;
                                        auVar110._8_4_ = uVar8;
                                        auVar110._12_4_ = uVar8;
                                        auVar110._16_4_ = uVar8;
                                        auVar110._20_4_ = uVar8;
                                        auVar110._24_4_ = uVar8;
                                        auVar110._28_4_ = uVar8;
                                        uVar24 = vptestmd_avx512vl(auVar110,*(undefined1 (*) [32])
                                                                             (ray + 0x120));
                                        bVar46 = (byte)uVar24 & bVar49;
                                        if (bVar46 != 0) {
                                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                             (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0))
                                          {
                                            auVar64 = vcvtsi2ss_avx512f(auVar63,*(ushort *)
                                                                                 (local_2bf0 + 8 +
                                                                                 local_2bf8) - 1);
                                            auVar65 = vcvtsi2ss_avx512f(auVar63,*(ushort *)
                                                                                 (local_2bf0 + 10 +
                                                                                 local_2bf8) - 1);
                                            auVar68 = vcvtsi2ss_avx512f(auVar63,((uint)uVar62 & 1) +
                                                                                local_2cc4);
                                            auVar63 = vcvtsi2ss_avx512f(auVar63,((uint)(uVar62 >> 1)
                                                                                & 0x7fffffff) +
                                                                                local_2cc8);
                                            local_2a00 = vpbroadcastd_avx512vl();
                                            auVar36._12_4_ = 0;
                                            auVar36._0_12_ = ZEXT812(0);
                                            auVar67 = vrcp14ss_avx512f(auVar36 << 0x20,
                                                                       ZEXT416(auVar64._0_4_));
                                            auVar64 = vfnmadd213ss_fma(auVar64,auVar67,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar133 = auVar67._0_4_ * auVar64._0_4_;
                                            fVar100 = auVar68._0_4_;
                                            auVar124._0_4_ = fVar100 * fVar125 + auVar71._0_4_;
                                            auVar124._4_4_ = fVar100 * fVar127 + auVar71._4_4_;
                                            auVar124._8_4_ = fVar100 * fVar128 + auVar71._8_4_;
                                            auVar124._12_4_ = fVar100 * fVar129 + auVar71._12_4_;
                                            auVar124._16_4_ = fVar100 * fVar130 + auVar71._16_4_;
                                            auVar124._20_4_ = fVar100 * fVar131 + auVar71._20_4_;
                                            auVar124._24_4_ = fVar100 * fVar132 + auVar71._24_4_;
                                            auVar124._28_4_ = fVar100 + auVar71._28_4_;
                                            auVar111._4_4_ = fVar133;
                                            auVar111._0_4_ = fVar133;
                                            auVar111._8_4_ = fVar133;
                                            auVar111._12_4_ = fVar133;
                                            auVar111._16_4_ = fVar133;
                                            auVar111._20_4_ = fVar133;
                                            auVar111._24_4_ = fVar133;
                                            auVar111._28_4_ = fVar133;
                                            auVar72 = vmulps_avx512vl(auVar124,auVar111);
                                            bVar61 = (bool)(bVar49 >> 1 & 1);
                                            bVar14 = (bool)(bVar49 >> 2 & 1);
                                            bVar16 = (bool)(bVar49 >> 3 & 1);
                                            bVar20 = (bool)(bVar49 >> 4 & 1);
                                            bVar18 = (bool)(bVar49 >> 5 & 1);
                                            bVar21 = (bool)(bVar49 >> 6 & 1);
                                            auVar68 = vrcp14ss_avx512f(auVar36 << 0x20,
                                                                       ZEXT416(auVar65._0_4_));
                                            auVar64 = vfnmadd213ss_fma(auVar65,auVar68,
                                                                       SUB6416(ZEXT464(0x40000000),0
                                                                              ));
                                            fVar133 = auVar68._0_4_ * auVar64._0_4_;
                                            auVar70 = vsubps_avx(auVar69,auVar104);
                                            fVar100 = auVar63._0_4_;
                                            auVar117._0_4_ = fVar100 * fVar125 + auVar70._0_4_;
                                            auVar117._4_4_ = fVar100 * fVar127 + auVar70._4_4_;
                                            auVar117._8_4_ = fVar100 * fVar128 + auVar70._8_4_;
                                            auVar117._12_4_ = fVar100 * fVar129 + auVar70._12_4_;
                                            auVar117._16_4_ = fVar100 * fVar130 + auVar70._16_4_;
                                            auVar117._20_4_ = fVar100 * fVar131 + auVar70._20_4_;
                                            auVar117._24_4_ = fVar100 * fVar132 + auVar70._24_4_;
                                            auVar117._28_4_ = fVar100 + auVar70._28_4_;
                                            auVar112._4_4_ = fVar133;
                                            auVar112._0_4_ = fVar133;
                                            auVar112._8_4_ = fVar133;
                                            auVar112._12_4_ = fVar133;
                                            auVar112._16_4_ = fVar133;
                                            auVar112._20_4_ = fVar133;
                                            auVar112._24_4_ = fVar133;
                                            auVar112._28_4_ = fVar133;
                                            auVar73 = vmulps_avx512vl(auVar117,auVar112);
                                            bVar13 = (bool)(bVar49 >> 1 & 1);
                                            bVar15 = (bool)(bVar49 >> 2 & 1);
                                            bVar17 = (bool)(bVar49 >> 3 & 1);
                                            bVar23 = (bool)(bVar49 >> 4 & 1);
                                            bVar19 = (bool)(bVar49 >> 5 & 1);
                                            bVar22 = (bool)(bVar49 >> 6 & 1);
                                            auVar75 = vrcp14ps_avx512vl(auVar69);
                                            auVar28._8_4_ = 0x3f800000;
                                            auVar28._0_8_ = 0x3f8000003f800000;
                                            auVar28._12_4_ = 0x3f800000;
                                            auVar28._16_4_ = 0x3f800000;
                                            auVar28._20_4_ = 0x3f800000;
                                            auVar28._24_4_ = 0x3f800000;
                                            auVar28._28_4_ = 0x3f800000;
                                            auVar69 = vfnmadd213ps_avx512vl(auVar69,auVar75,auVar28)
                                            ;
                                            auVar63 = vfmadd132ps_fma(auVar69,auVar75,auVar75);
                                            local_2a40._4_4_ =
                                                 (float)((uint)bVar13 * auVar73._4_4_ |
                                                        (uint)!bVar13 * (int)auVar70._4_4_) *
                                                 auVar63._4_4_;
                                            local_2a40._0_4_ =
                                                 (float)((uint)(bVar49 & 1) * auVar73._0_4_ |
                                                        (uint)!(bool)(bVar49 & 1) *
                                                        (int)auVar70._0_4_) * auVar63._0_4_;
                                            fStack_2a38 = (float)((uint)bVar15 * auVar73._8_4_ |
                                                                 (uint)!bVar15 * (int)auVar70._8_4_)
                                                          * auVar63._8_4_;
                                            fStack_2a34 = (float)((uint)bVar17 * auVar73._12_4_ |
                                                                 (uint)!bVar17 * (int)auVar70._12_4_
                                                                 ) * auVar63._12_4_;
                                            fStack_2a30 = (float)((uint)bVar23 * auVar73._16_4_ |
                                                                 (uint)!bVar23 * (int)auVar70._16_4_
                                                                 ) * 0.0;
                                            fStack_2a2c = (float)((uint)bVar19 * auVar73._20_4_ |
                                                                 (uint)!bVar19 * (int)auVar70._20_4_
                                                                 ) * 0.0;
                                            fStack_2a28 = (float)((uint)bVar22 * auVar73._24_4_ |
                                                                 (uint)!bVar22 * (int)auVar70._24_4_
                                                                 ) * 0.0;
                                            fStack_2a24 = (float)((uint)(bVar49 >> 7) *
                                                                  auVar73._28_4_ |
                                                                 (uint)!(bool)(bVar49 >> 7) *
                                                                 (int)auVar70._28_4_);
                                            local_2a20 = vpbroadcastd_avx512vl();
                                            pRVar12 = context->user;
                                            local_2ac0[0] = (RTCHitN)auVar81[0];
                                            local_2ac0[1] = (RTCHitN)auVar81[1];
                                            local_2ac0[2] = (RTCHitN)auVar81[2];
                                            local_2ac0[3] = (RTCHitN)auVar81[3];
                                            local_2ac0[4] = (RTCHitN)auVar81[4];
                                            local_2ac0[5] = (RTCHitN)auVar81[5];
                                            local_2ac0[6] = (RTCHitN)auVar81[6];
                                            local_2ac0[7] = (RTCHitN)auVar81[7];
                                            local_2ac0[8] = (RTCHitN)auVar81[8];
                                            local_2ac0[9] = (RTCHitN)auVar81[9];
                                            local_2ac0[10] = (RTCHitN)auVar81[10];
                                            local_2ac0[0xb] = (RTCHitN)auVar81[0xb];
                                            local_2ac0[0xc] = (RTCHitN)auVar81[0xc];
                                            local_2ac0[0xd] = (RTCHitN)auVar81[0xd];
                                            local_2ac0[0xe] = (RTCHitN)auVar81[0xe];
                                            local_2ac0[0xf] = (RTCHitN)auVar81[0xf];
                                            local_2ac0[0x10] = (RTCHitN)auVar81[0x10];
                                            local_2ac0[0x11] = (RTCHitN)auVar81[0x11];
                                            local_2ac0[0x12] = (RTCHitN)auVar81[0x12];
                                            local_2ac0[0x13] = (RTCHitN)auVar81[0x13];
                                            local_2ac0[0x14] = (RTCHitN)auVar81[0x14];
                                            local_2ac0[0x15] = (RTCHitN)auVar81[0x15];
                                            local_2ac0[0x16] = (RTCHitN)auVar81[0x16];
                                            local_2ac0[0x17] = (RTCHitN)auVar81[0x17];
                                            local_2ac0[0x18] = (RTCHitN)auVar81[0x18];
                                            local_2ac0[0x19] = (RTCHitN)auVar81[0x19];
                                            local_2ac0[0x1a] = (RTCHitN)auVar81[0x1a];
                                            local_2ac0[0x1b] = (RTCHitN)auVar81[0x1b];
                                            local_2ac0[0x1c] = (RTCHitN)auVar81[0x1c];
                                            local_2ac0[0x1d] = (RTCHitN)auVar81[0x1d];
                                            local_2ac0[0x1e] = (RTCHitN)auVar81[0x1e];
                                            local_2ac0[0x1f] = (RTCHitN)auVar81[0x1f];
                                            local_2aa0 = auVar82;
                                            local_2a80 = auVar83;
                                            local_2a60._4_4_ =
                                                 (float)((uint)bVar61 * auVar72._4_4_ |
                                                        (uint)!bVar61 * (int)auVar71._4_4_) *
                                                 auVar63._4_4_;
                                            local_2a60._0_4_ =
                                                 (float)((uint)(bVar49 & 1) * auVar72._0_4_ |
                                                        (uint)!(bool)(bVar49 & 1) *
                                                        (int)auVar71._0_4_) * auVar63._0_4_;
                                            fStack_2a58 = (float)((uint)bVar14 * auVar72._8_4_ |
                                                                 (uint)!bVar14 * (int)auVar71._8_4_)
                                                          * auVar63._8_4_;
                                            fStack_2a54 = (float)((uint)bVar16 * auVar72._12_4_ |
                                                                 (uint)!bVar16 * (int)auVar71._12_4_
                                                                 ) * auVar63._12_4_;
                                            fStack_2a50 = (float)((uint)bVar20 * auVar72._16_4_ |
                                                                 (uint)!bVar20 * (int)auVar71._16_4_
                                                                 ) * 0.0;
                                            fStack_2a4c = (float)((uint)bVar18 * auVar72._20_4_ |
                                                                 (uint)!bVar18 * (int)auVar71._20_4_
                                                                 ) * 0.0;
                                            fStack_2a48 = (float)((uint)bVar21 * auVar72._24_4_ |
                                                                 (uint)!bVar21 * (int)auVar71._24_4_
                                                                 ) * 0.0;
                                            uStack_2a44 = (uint)(bVar49 >> 7) * auVar72._28_4_ |
                                                          (uint)!(bool)(bVar49 >> 7) *
                                                          (int)auVar71._28_4_;
                                            auVar69 = vpcmpeqd_avx2(_local_2a40,_local_2a40);
                                            local_2c08[1] = auVar69;
                                            *local_2c08 = auVar69;
                                            local_29e0 = pRVar12->instID[0];
                                            uStack_29dc = local_29e0;
                                            uStack_29d8 = local_29e0;
                                            uStack_29d4 = local_29e0;
                                            uStack_29d0 = local_29e0;
                                            uStack_29cc = local_29e0;
                                            uStack_29c8 = local_29e0;
                                            uStack_29c4 = local_29e0;
                                            local_29c0 = pRVar12->instPrimID[0];
                                            uStack_29bc = local_29c0;
                                            uStack_29b8 = local_29c0;
                                            uStack_29b4 = local_29c0;
                                            uStack_29b0 = local_29c0;
                                            uStack_29ac = local_29c0;
                                            uStack_29a8 = local_29c0;
                                            uStack_29a4 = local_29c0;
                                            local_2c40._0_4_ = auVar45._0_4_;
                                            local_2c40._4_4_ = auVar45._4_4_;
                                            fStack_2c38 = auVar45._8_4_;
                                            fStack_2c34 = auVar45._12_4_;
                                            fStack_2c30 = auVar45._16_4_;
                                            fStack_2c2c = auVar45._20_4_;
                                            fStack_2c28 = auVar45._24_4_;
                                            auVar69 = vmulps_avx512vl(ZEXT1632(auVar63),auVar97);
                                            auVar87._0_4_ =
                                                 (uint)(bVar46 & 1) * auVar69._0_4_ |
                                                 (uint)!(bool)(bVar46 & 1) * local_2c40._0_4_;
                                            bVar61 = (bool)(bVar46 >> 1 & 1);
                                            auVar87._4_4_ =
                                                 (uint)bVar61 * auVar69._4_4_ |
                                                 (uint)!bVar61 * local_2c40._4_4_;
                                            bVar61 = (bool)(bVar46 >> 2 & 1);
                                            auVar87._8_4_ =
                                                 (uint)bVar61 * auVar69._8_4_ |
                                                 (uint)!bVar61 * (int)fStack_2c38;
                                            bVar61 = (bool)(bVar46 >> 3 & 1);
                                            auVar87._12_4_ =
                                                 (uint)bVar61 * auVar69._12_4_ |
                                                 (uint)!bVar61 * (int)fStack_2c34;
                                            bVar61 = (bool)(bVar46 >> 4 & 1);
                                            auVar87._16_4_ =
                                                 (uint)bVar61 * auVar69._16_4_ |
                                                 (uint)!bVar61 * (int)fStack_2c30;
                                            bVar61 = (bool)(bVar46 >> 5 & 1);
                                            auVar87._20_4_ =
                                                 (uint)bVar61 * auVar69._20_4_ |
                                                 (uint)!bVar61 * (int)fStack_2c2c;
                                            bVar61 = (bool)(bVar46 >> 6 & 1);
                                            auVar87._24_4_ =
                                                 (uint)bVar61 * auVar69._24_4_ |
                                                 (uint)!bVar61 * (int)fStack_2c28;
                                            auVar87._28_4_ =
                                                 (uint)(bVar46 >> 7) * auVar69._28_4_ |
                                                 (uint)!(bool)(bVar46 >> 7) * iVar47;
                                            *(undefined1 (*) [32])(ray + 0x100) = auVar87;
                                            local_2be0 = vpmovm2d_avx512vl((ulong)bVar46);
                                            local_2c70.geometryUserPtr = pGVar9->userPtr;
                                            local_2c70.valid = (int *)local_2be0;
                                            local_2c70.context = context->user;
                                            local_2c70.ray = (RTCRayN *)ray;
                                            local_2c70.hit = local_2ac0;
                                            local_2c70.N = 8;
                                            _local_2c40 = auVar74;
                                            if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                            {
                                              (*pGVar9->occlusionFilterN)(&local_2c70);
                                            }
                                            if (local_2be0 == (undefined1  [32])0x0) {
                                              uVar53 = 0;
                                            }
                                            else {
                                              p_Var11 = context->args->filter;
                                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                                 (((context->args->flags &
                                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                  ((*(byte *)(CONCAT44(fStack_2c9c,local_2ca0) +
                                                             0x3e) & 0x40) != 0)))) {
                                                (*p_Var11)(&local_2c70);
                                              }
                                              uVar53 = vptestmd_avx512vl(local_2be0,local_2be0);
                                              auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                              bVar61 = (bool)((byte)uVar53 & 1);
                                              bVar13 = (bool)((byte)(uVar53 >> 1) & 1);
                                              bVar14 = (bool)((byte)(uVar53 >> 2) & 1);
                                              bVar15 = (bool)((byte)(uVar53 >> 3) & 1);
                                              bVar16 = (bool)((byte)(uVar53 >> 4) & 1);
                                              bVar17 = (bool)((byte)(uVar53 >> 5) & 1);
                                              bVar20 = (bool)((byte)(uVar53 >> 6) & 1);
                                              bVar23 = SUB81(uVar53 >> 7,0);
                                              *(uint *)(local_2c70.ray + 0x100) =
                                                   (uint)bVar61 * auVar69._0_4_ |
                                                   (uint)!bVar61 * *(int *)(local_2c70.ray + 0x100);
                                              *(uint *)(local_2c70.ray + 0x104) =
                                                   (uint)bVar13 * auVar69._4_4_ |
                                                   (uint)!bVar13 * *(int *)(local_2c70.ray + 0x104);
                                              *(uint *)(local_2c70.ray + 0x108) =
                                                   (uint)bVar14 * auVar69._8_4_ |
                                                   (uint)!bVar14 * *(int *)(local_2c70.ray + 0x108);
                                              *(uint *)(local_2c70.ray + 0x10c) =
                                                   (uint)bVar15 * auVar69._12_4_ |
                                                   (uint)!bVar15 * *(int *)(local_2c70.ray + 0x10c);
                                              *(uint *)(local_2c70.ray + 0x110) =
                                                   (uint)bVar16 * auVar69._16_4_ |
                                                   (uint)!bVar16 * *(int *)(local_2c70.ray + 0x110);
                                              *(uint *)(local_2c70.ray + 0x114) =
                                                   (uint)bVar17 * auVar69._20_4_ |
                                                   (uint)!bVar17 * *(int *)(local_2c70.ray + 0x114);
                                              *(uint *)(local_2c70.ray + 0x118) =
                                                   (uint)bVar20 * auVar69._24_4_ |
                                                   (uint)!bVar20 * *(int *)(local_2c70.ray + 0x118);
                                              *(uint *)(local_2c70.ray + 0x11c) =
                                                   (uint)bVar23 * auVar69._28_4_ |
                                                   (uint)!bVar23 * *(int *)(local_2c70.ray + 0x11c);
                                            }
                                            bVar46 = (byte)uVar53;
                                            bVar61 = (bool)((byte)(uVar53 >> 1) & 1);
                                            bVar13 = (bool)((byte)(uVar53 >> 2) & 1);
                                            bVar14 = (bool)((byte)(uVar53 >> 3) & 1);
                                            bVar15 = (bool)((byte)(uVar53 >> 4) & 1);
                                            bVar16 = (bool)((byte)(uVar53 >> 5) & 1);
                                            bVar17 = (bool)((byte)(uVar53 >> 6) & 1);
                                            bVar20 = (bool)((byte)(uVar53 >> 7) & 1);
                                            *(uint *)local_2c00 =
                                                 (uint)(bVar46 & 1) * *(int *)local_2c00 |
                                                 (uint)!(bool)(bVar46 & 1) * local_2c40._0_4_;
                                            *(uint *)(local_2c00 + 4) =
                                                 (uint)bVar61 * *(int *)(local_2c00 + 4) |
                                                 (uint)!bVar61 * local_2c40._4_4_;
                                            *(uint *)(local_2c00 + 8) =
                                                 (uint)bVar13 * *(int *)(local_2c00 + 8) |
                                                 (uint)!bVar13 * (int)fStack_2c38;
                                            *(uint *)(local_2c00 + 0xc) =
                                                 (uint)bVar14 * *(int *)(local_2c00 + 0xc) |
                                                 (uint)!bVar14 * (int)fStack_2c34;
                                            *(uint *)(local_2c00 + 0x10) =
                                                 (uint)bVar15 * *(int *)(local_2c00 + 0x10) |
                                                 (uint)!bVar15 * (int)fStack_2c30;
                                            *(uint *)(local_2c00 + 0x14) =
                                                 (uint)bVar16 * *(int *)(local_2c00 + 0x14) |
                                                 (uint)!bVar16 * (int)fStack_2c2c;
                                            *(uint *)(local_2c00 + 0x18) =
                                                 (uint)bVar17 * *(int *)(local_2c00 + 0x18) |
                                                 (uint)!bVar17 * (int)fStack_2c28;
                                            *(uint *)(local_2c00 + 0x1c) =
                                                 (uint)bVar20 * *(int *)(local_2c00 + 0x1c) |
                                                 (uint)!bVar20 * (int)fStack_2c24;
                                          }
                                          bVar54 = bVar54 & ~bVar46;
                                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                          auVar146 = ZEXT3264(auVar69);
                                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          auVar147 = ZEXT3264(auVar69);
                                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar148 = ZEXT3264(auVar69);
                                          auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar149 = ZEXT3264(auVar69);
                                          auVar63 = vxorps_avx512vl(auVar88,auVar88);
                                          auVar150 = ZEXT1664(auVar63);
                                          auVar63 = vmovdqa64_avx512vl(local_2cb0);
                                          auVar99 = ZEXT1664(auVar63);
                                          auVar63 = vmovdqa64_avx512vl(local_2cc0);
                                          auVar151 = ZEXT1664(auVar63);
                                          goto LAB_00714a66;
                                        }
                                      }
                                    }
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar146 = ZEXT3264(auVar69);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar147 = ZEXT3264(auVar69);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar148 = ZEXT3264(auVar69);
                                    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar149 = ZEXT3264(auVar69);
                                    auVar63 = vxorps_avx512vl(auVar88,auVar88);
                                    auVar150 = ZEXT1664(auVar63);
                                    auVar63 = vmovdqa64_avx512vl(local_2cb0);
                                    auVar99 = ZEXT1664(auVar63);
                                    auVar63 = vmovdqa64_avx512vl(local_2cc0);
                                    auVar151 = ZEXT1664(auVar63);
                                  }
                                }
                              }
LAB_00714a66:
                              if (bVar54 == 0) break;
                              pfVar60 = pfVar60 + 0x10;
                              bVar61 = uVar62 < 3;
                              uVar62 = uVar62 + 1;
                            } while (bVar61);
                            bVar50 = bVar50 & bVar54;
                            bVar61 = bVar50 == 0;
                            uVar53 = local_2b48;
                            uVar62 = local_2be8;
                            lVar51 = local_2b50;
                          }
                        } while ((!bVar61) && (uVar53 = uVar53 - 1 & uVar53, uVar53 != 0));
                      }
                      lVar51 = local_2b58 + 1;
                    } while (lVar51 != local_2b60);
                    bVar50 = ~bVar50;
                  }
                  auVar69 = auVar147._0_32_;
                  local_2ce4 = local_2ce4 | bVar50;
                  if (local_2ce4 == 0xff) {
                    local_2ce4 = 0xff;
                    goto LAB_00715532;
                  }
                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar61 = (bool)(local_2ce4 >> 1 & 1);
                  bVar13 = (bool)(local_2ce4 >> 2 & 1);
                  bVar14 = (bool)(local_2ce4 >> 3 & 1);
                  bVar15 = (bool)(local_2ce4 >> 4 & 1);
                  bVar16 = (bool)(local_2ce4 >> 5 & 1);
                  bVar17 = (bool)(local_2ce4 >> 6 & 1);
                  local_27a0 = (uint)(local_2ce4 & 1) * auVar69._0_4_ |
                               !(bool)(local_2ce4 & 1) * local_27a0;
                  uStack_279c = (uint)bVar61 * auVar69._4_4_ | !bVar61 * uStack_279c;
                  uStack_2798 = (uint)bVar13 * auVar69._8_4_ | !bVar13 * uStack_2798;
                  uStack_2794 = (uint)bVar14 * auVar69._12_4_ | !bVar14 * uStack_2794;
                  uStack_2790 = (uint)bVar15 * auVar69._16_4_ | !bVar15 * uStack_2790;
                  uStack_278c = (uint)bVar16 * auVar69._20_4_ | !bVar16 * uStack_278c;
                  uStack_2788 = (uint)bVar17 * auVar69._24_4_ | !bVar17 * uStack_2788;
                  uStack_2784 = (uint)(local_2ce4 >> 7) * auVar69._28_4_ |
                                !(bool)(local_2ce4 >> 7) * uStack_2784;
                }
                goto LAB_00714212;
              }
              lVar51 = 0;
              auVar69 = auVar148._0_32_;
              do {
                uVar53 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar51 * 8);
                if (uVar53 == 8) {
                  auVar99 = ZEXT3264(auVar69);
                  break;
                }
                auVar78._4_4_ = fStack_287c;
                auVar78._0_4_ = local_2880;
                auVar78._8_4_ = fStack_2878;
                auVar78._12_4_ = fStack_2874;
                auVar78._16_4_ = fStack_2870;
                auVar78._20_4_ = fStack_286c;
                auVar78._24_4_ = fStack_2868;
                auVar78._28_4_ = uStack_2864;
                uVar59 = *(undefined4 *)(root.ptr + 0x20 + lVar51 * 4);
                auVar81._4_4_ = uVar59;
                auVar81._0_4_ = uVar59;
                auVar81._8_4_ = uVar59;
                auVar81._12_4_ = uVar59;
                auVar81._16_4_ = uVar59;
                auVar81._20_4_ = uVar59;
                auVar81._24_4_ = uVar59;
                auVar81._28_4_ = uVar59;
                auVar63 = vfmsub132ps_fma(auVar81,auVar78,local_28e0);
                auVar79._4_4_ = fStack_285c;
                auVar79._0_4_ = local_2860;
                auVar79._8_4_ = fStack_2858;
                auVar79._12_4_ = fStack_2854;
                auVar79._16_4_ = fStack_2850;
                auVar79._20_4_ = fStack_284c;
                auVar79._24_4_ = fStack_2848;
                auVar79._28_4_ = uStack_2844;
                uVar59 = *(undefined4 *)(root.ptr + 0x40 + lVar51 * 4);
                auVar82._4_4_ = uVar59;
                auVar82._0_4_ = uVar59;
                auVar82._8_4_ = uVar59;
                auVar82._12_4_ = uVar59;
                auVar82._16_4_ = uVar59;
                auVar82._20_4_ = uVar59;
                auVar82._24_4_ = uVar59;
                auVar82._28_4_ = uVar59;
                uVar59 = *(undefined4 *)(root.ptr + 0x60 + lVar51 * 4);
                auVar83._4_4_ = uVar59;
                auVar83._0_4_ = uVar59;
                auVar83._8_4_ = uVar59;
                auVar83._12_4_ = uVar59;
                auVar83._16_4_ = uVar59;
                auVar83._20_4_ = uVar59;
                auVar83._24_4_ = uVar59;
                auVar83._28_4_ = uVar59;
                auVar64 = vfmsub132ps_fma(auVar82,auVar79,local_28c0);
                auVar65 = vfmsub132ps_fma(auVar83,local_2840,local_28a0);
                uVar59 = *(undefined4 *)(root.ptr + 0x30 + lVar51 * 4);
                auVar75._4_4_ = uVar59;
                auVar75._0_4_ = uVar59;
                auVar75._8_4_ = uVar59;
                auVar75._12_4_ = uVar59;
                auVar75._16_4_ = uVar59;
                auVar75._20_4_ = uVar59;
                auVar75._24_4_ = uVar59;
                auVar75._28_4_ = uVar59;
                auVar70 = vfmsub132ps_avx512vl(local_28e0,auVar78,auVar75);
                uVar59 = *(undefined4 *)(root.ptr + 0x50 + lVar51 * 4);
                auVar76._4_4_ = uVar59;
                auVar76._0_4_ = uVar59;
                auVar76._8_4_ = uVar59;
                auVar76._12_4_ = uVar59;
                auVar76._16_4_ = uVar59;
                auVar76._20_4_ = uVar59;
                auVar76._24_4_ = uVar59;
                auVar76._28_4_ = uVar59;
                auVar72 = vfmsub132ps_avx512vl(local_28c0,auVar79,auVar76);
                uVar59 = *(undefined4 *)(root.ptr + 0x70 + lVar51 * 4);
                auVar77._4_4_ = uVar59;
                auVar77._0_4_ = uVar59;
                auVar77._8_4_ = uVar59;
                auVar77._12_4_ = uVar59;
                auVar77._16_4_ = uVar59;
                auVar77._20_4_ = uVar59;
                auVar77._24_4_ = uVar59;
                auVar77._28_4_ = uVar59;
                auVar73 = vfmsub132ps_avx512vl(local_28a0,local_2840,auVar77);
                auVar71 = vpminsd_avx2(ZEXT1632(auVar63),auVar70);
                auVar74 = vpminsd_avx2(ZEXT1632(auVar64),auVar72);
                auVar71 = vpmaxsd_avx2(auVar71,auVar74);
                auVar74 = vpminsd_avx2(ZEXT1632(auVar65),auVar73);
                auVar71 = vpmaxsd_avx2(auVar71,auVar74);
                auVar74 = vpmaxsd_avx2(ZEXT1632(auVar63),auVar70);
                auVar70 = vpmaxsd_avx2(ZEXT1632(auVar64),auVar72);
                auVar70 = vpminsd_avx2(auVar74,auVar70);
                auVar74 = vpmaxsd_avx2(ZEXT1632(auVar65),auVar73);
                auVar70 = vpminsd_avx2(auVar70,auVar74);
                auVar74 = vpmaxsd_avx2(auVar71,local_27c0);
                auVar80._4_4_ = uStack_279c;
                auVar80._0_4_ = local_27a0;
                auVar80._8_4_ = uStack_2798;
                auVar80._12_4_ = uStack_2794;
                auVar80._16_4_ = uStack_2790;
                auVar80._20_4_ = uStack_278c;
                auVar80._24_4_ = uStack_2788;
                auVar80._28_4_ = uStack_2784;
                auVar70 = vpminsd_avx2(auVar70,auVar80);
                uVar48 = vpcmpd_avx512vl(auVar74,auVar70,2);
                if ((byte)uVar48 == 0) {
                  auVar99 = ZEXT3264(auVar69);
                  uVar53 = uVar57;
                }
                else {
                  auVar74 = vblendmps_avx512vl(auVar148._0_32_,auVar71);
                  bVar61 = (bool)((byte)uVar48 & 1);
                  bVar13 = (bool)((byte)(uVar48 >> 1) & 1);
                  bVar14 = (bool)((byte)(uVar48 >> 2) & 1);
                  bVar15 = (bool)((byte)(uVar48 >> 3) & 1);
                  bVar16 = (bool)((byte)(uVar48 >> 4) & 1);
                  bVar17 = (bool)((byte)(uVar48 >> 5) & 1);
                  bVar20 = (bool)((byte)(uVar48 >> 6) & 1);
                  bVar23 = SUB81(uVar48 >> 7,0);
                  auVar99 = ZEXT3264(CONCAT428((uint)bVar23 * auVar74._28_4_ |
                                               (uint)!bVar23 * auVar71._28_4_,
                                               CONCAT424((uint)bVar20 * auVar74._24_4_ |
                                                         (uint)!bVar20 * auVar71._24_4_,
                                                         CONCAT420((uint)bVar17 * auVar74._20_4_ |
                                                                   (uint)!bVar17 * auVar71._20_4_,
                                                                   CONCAT416((uint)bVar16 *
                                                                             auVar74._16_4_ |
                                                                             (uint)!bVar16 *
                                                                             auVar71._16_4_,
                                                                             CONCAT412((uint)bVar15
                                                                                       * auVar74.
                                                  _12_4_ | (uint)!bVar15 * auVar71._12_4_,
                                                  CONCAT48((uint)bVar14 * auVar74._8_4_ |
                                                           (uint)!bVar14 * auVar71._8_4_,
                                                           CONCAT44((uint)bVar13 * auVar74._4_4_ |
                                                                    (uint)!bVar13 * auVar71._4_4_,
                                                                    (uint)bVar61 * auVar74._0_4_ |
                                                                    (uint)!bVar61 * auVar71._0_4_)))
                                                  )))));
                  if (uVar57 != 8) {
                    *puVar56 = uVar57;
                    puVar56 = puVar56 + 1;
                    *pauVar52 = auVar69;
                    pauVar52 = pauVar52 + 1;
                  }
                }
                uVar57 = uVar53;
                lVar51 = lVar51 + 1;
                auVar69 = auVar99._0_32_;
              } while (lVar51 != 4);
              if (uVar57 == 8) goto LAB_007143be;
              auVar84._4_4_ = uStack_279c;
              auVar84._0_4_ = local_27a0;
              auVar84._8_4_ = uStack_2798;
              auVar84._12_4_ = uStack_2794;
              auVar84._16_4_ = uStack_2790;
              auVar84._20_4_ = uStack_278c;
              auVar84._24_4_ = uStack_2788;
              auVar84._28_4_ = uStack_2784;
              uVar24 = vcmpps_avx512vl(auVar99._0_32_,auVar84,9);
              root.ptr = uVar57;
            } while ((byte)uVar62 < (byte)POPCOUNT((int)uVar24));
            *puVar56 = uVar57;
            puVar56 = puVar56 + 1;
            *pauVar52 = auVar99._0_32_;
            pauVar52 = pauVar52 + 1;
LAB_007143be:
            iVar47 = 4;
          }
          else {
            do {
              k = 0;
              for (uVar62 = uVar57; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              local_2ca0 = (float)k;
              fStack_2c9c = (float)(k >> 0x20);
              bVar61 = occluded1(local_2b68,local_2b70,root,k,&local_2cc9,ray,
                                 (TravRayK<8,_false> *)&local_29a0.field_0,context);
              bVar50 = (byte)(1 << ((uint)local_2ca0 & 0x1f));
              if (!bVar61) {
                bVar50 = 0;
              }
              local_2ce4 = local_2ce4 | bVar50;
              uVar57 = uVar57 - 1 & uVar57;
            } while (uVar57 != 0);
            iVar47 = 3;
            if (local_2ce4 != 0xff) {
              auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar61 = (bool)(local_2ce4 >> 1 & 1);
              bVar13 = (bool)(local_2ce4 >> 2 & 1);
              bVar14 = (bool)(local_2ce4 >> 3 & 1);
              bVar15 = (bool)(local_2ce4 >> 4 & 1);
              bVar16 = (bool)(local_2ce4 >> 5 & 1);
              bVar17 = (bool)(local_2ce4 >> 6 & 1);
              local_27a0 = (uint)(local_2ce4 & 1) * auVar69._0_4_ |
                           !(bool)(local_2ce4 & 1) * local_27a0;
              uStack_279c = (uint)bVar61 * auVar69._4_4_ | !bVar61 * uStack_279c;
              uStack_2798 = (uint)bVar13 * auVar69._8_4_ | !bVar13 * uStack_2798;
              uStack_2794 = (uint)bVar14 * auVar69._12_4_ | !bVar14 * uStack_2794;
              uStack_2790 = (uint)bVar15 * auVar69._16_4_ | !bVar15 * uStack_2790;
              uStack_278c = (uint)bVar16 * auVar69._20_4_ | !bVar16 * uStack_278c;
              uStack_2788 = (uint)bVar17 * auVar69._24_4_ | !bVar17 * uStack_2788;
              uStack_2784 = (uint)(local_2ce4 >> 7) * auVar69._28_4_ |
                            !(bool)(local_2ce4 >> 7) * uStack_2784;
              iVar47 = 2;
            }
            auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar146 = ZEXT3264(auVar69);
            auVar69 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar147 = ZEXT3264(auVar69);
            auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar148 = ZEXT3264(auVar69);
            auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar149 = ZEXT3264(auVar69);
            auVar63 = vxorps_avx512vl(auVar150._0_16_,auVar150._0_16_);
            auVar150 = ZEXT1664(auVar63);
            auVar99 = ZEXT3264(_local_2c40);
            uVar62 = local_2be8;
            if ((uint)local_2be8 < (uint)POPCOUNT(uVar59)) goto LAB_0071425a;
          }
          auVar69 = auVar147._0_32_;
          if (iVar47 == 3) {
LAB_00715532:
            local_2ce4 = local_2ce4 & (byte)local_2c74;
            bVar61 = (bool)(local_2ce4 >> 1 & 1);
            bVar13 = (bool)(local_2ce4 >> 2 & 1);
            bVar14 = (bool)(local_2ce4 >> 3 & 1);
            bVar15 = (bool)(local_2ce4 >> 4 & 1);
            bVar16 = (bool)(local_2ce4 >> 5 & 1);
            bVar17 = (bool)(local_2ce4 >> 6 & 1);
            *(uint *)local_2c00 =
                 (uint)(local_2ce4 & 1) * auVar69._0_4_ |
                 (uint)!(bool)(local_2ce4 & 1) * *(int *)local_2c00;
            *(uint *)(local_2c00 + 4) =
                 (uint)bVar61 * auVar69._4_4_ | (uint)!bVar61 * *(int *)(local_2c00 + 4);
            *(uint *)(local_2c00 + 8) =
                 (uint)bVar13 * auVar69._8_4_ | (uint)!bVar13 * *(int *)(local_2c00 + 8);
            *(uint *)(local_2c00 + 0xc) =
                 (uint)bVar14 * auVar69._12_4_ | (uint)!bVar14 * *(int *)(local_2c00 + 0xc);
            *(uint *)(local_2c00 + 0x10) =
                 (uint)bVar15 * auVar69._16_4_ | (uint)!bVar15 * *(int *)(local_2c00 + 0x10);
            *(uint *)(local_2c00 + 0x14) =
                 (uint)bVar16 * auVar69._20_4_ | (uint)!bVar16 * *(int *)(local_2c00 + 0x14);
            *(uint *)(local_2c00 + 0x18) =
                 (uint)bVar17 * auVar69._24_4_ | (uint)!bVar17 * *(int *)(local_2c00 + 0x18);
            *(uint *)(local_2c00 + 0x1c) =
                 (uint)(local_2ce4 >> 7) * auVar69._28_4_ |
                 (uint)!(bool)(local_2ce4 >> 7) * *(int *)(local_2c00 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }